

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O1

void av1_compute_stats_avx2
               (int wiener_win,uint8_t *dgd,uint8_t *src,int16_t *dgd_avg,int16_t *src_avg,
               int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,int64_t *M,
               int64_t *H,int use_downsampled_wiener_stats)

{
  undefined1 auVar1 [32];
  int64_t iVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  ushort uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  int iVar119;
  uint8_t *puVar120;
  long lVar121;
  int16_t *piVar122;
  int16_t *piVar123;
  undefined1 (*pauVar124) [32];
  undefined1 (*pauVar125) [32];
  long lVar126;
  long lVar127;
  ulong uVar128;
  int16_t *piVar129;
  uint uVar130;
  uint uVar131;
  long lVar132;
  undefined1 (*pauVar133) [32];
  int iVar134;
  ulong uVar135;
  long lVar136;
  long lVar137;
  ulong uVar138;
  uint uVar139;
  long lVar140;
  undefined1 (*pauVar141) [32];
  ulong uVar142;
  int iVar143;
  uint uVar144;
  int iVar145;
  ushort uVar146;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar149 [16];
  undefined1 auVar150 [64];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  long local_290;
  long local_280;
  long local_278;
  long local_268;
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  if ((wiener_win & 0xfffffffdU) == 5) {
    lVar126 = (long)h_start;
    uVar144 = h_end - h_start;
    iVar145 = v_end - v_start;
    uVar130 = uVar144 & 0x1f;
    if (uVar130 < 0x10) {
      auVar4 = *(undefined1 (*) [16])(mask_8bit + (0x10 - (ulong)uVar130));
      auVar149 = (undefined1  [16])0x0;
    }
    else {
      auVar149 = *(undefined1 (*) [16])((long)mask_16bit - (ulong)uVar130);
      auVar4 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    }
    puVar120 = dgd + dgd_stride * v_start + lVar126;
    auVar147._0_16_ = ZEXT116(0) * auVar149 + ZEXT116(1) * auVar4;
    auVar147._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar149;
    iVar119 = 1;
    if (1 < iVar145) {
      iVar119 = iVar145;
    }
    iVar143 = 0;
    auVar150 = ZEXT1664((undefined1  [16])0x0);
    do {
      lVar137 = 0;
      if (0 < (int)(uVar144 & 0xffffffe0)) {
        do {
          auVar148 = vpsadbw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                  *(undefined1 (*) [32])(puVar120 + lVar137));
          auVar148 = vpaddd_avx2(auVar150._0_32_,auVar148);
          auVar150 = ZEXT3264(auVar148);
          lVar137 = lVar137 + 0x20;
        } while (lVar137 < (int)(uVar144 & 0xffffffe0));
      }
      if (uVar130 != 0) {
        auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(puVar120 + lVar137));
        auVar148 = vpsadbw_avx2(auVar148,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar148 = vpaddd_avx2(auVar150._0_32_,auVar148);
        auVar150 = ZEXT3264(auVar148);
      }
      puVar120 = puVar120 + dgd_stride;
      iVar143 = iVar143 + 1;
    } while (iVar143 != iVar119);
    auVar149 = vphaddd_avx(auVar150._16_16_,auVar150._0_16_);
    auVar149 = vphaddd_avx(auVar149,auVar149);
    auVar149 = vphaddd_avx(auVar149,auVar149);
    iVar143 = 0;
    uVar130 = wiener_win & 6;
    uVar131 = uVar144 + 0xf & 0xfffffff0;
    puVar120 = src + src_stride * v_start + lVar126;
    uVar7 = (ushort)(auVar149._0_4_ / (iVar145 * uVar144));
    uVar146 = uVar7 & 0xff;
    auVar148._0_8_ = CONCAT26(uVar7,CONCAT24(uVar7,CONCAT22(uVar7,uVar7))) & 0xff00ff00ff00ff;
    auVar148._8_2_ = uVar146;
    auVar148._10_2_ = uVar146;
    auVar148._12_2_ = uVar146;
    auVar148._14_2_ = uVar146;
    auVar148._16_2_ = uVar146;
    auVar148._18_2_ = uVar146;
    auVar148._20_2_ = uVar146;
    auVar148._22_2_ = uVar146;
    auVar148._24_2_ = uVar146;
    auVar148._26_2_ = uVar146;
    auVar148._28_2_ = uVar146;
    auVar148._30_2_ = uVar146;
    iVar119 = (uint)(use_downsampled_wiener_stats != 0) * 3 + 1;
    piVar123 = src_avg;
    do {
      iVar134 = iVar145 - iVar143;
      if (3 < iVar145 - iVar143) {
        iVar134 = iVar119;
      }
      if (use_downsampled_wiener_stats == 0) {
        iVar134 = 1;
      }
      if (0 < (int)uVar144) {
        lVar137 = 0;
        do {
          auVar147 = vpmovzxbw_avx2(*(undefined1 (*) [16])(puVar120 + lVar137));
          auVar147 = vpsubw_avx2(auVar147,auVar148);
          *(undefined1 (*) [32])(piVar123 + lVar137) = auVar147;
          lVar137 = lVar137 + 0x10;
        } while (lVar137 < (int)uVar144);
      }
      puVar120 = puVar120 + iVar134 * src_stride;
      piVar123 = piVar123 + (int)(iVar134 * uVar131);
      iVar143 = iVar143 + iVar134;
    } while (iVar143 < iVar145);
    uVar139 = uVar144 + uVar130 + 0xf & 0xfffffff0;
    puVar120 = dgd + (((int)((v_start - ((uint)wiener_win >> 1)) * dgd_stride) + lVar126) -
                     (ulong)((uint)wiener_win >> 1));
    iVar143 = 1;
    if (1 < (int)(iVar145 + uVar130)) {
      iVar143 = iVar145 + uVar130;
    }
    lVar137 = (long)(int)uVar139;
    lVar126 = lVar137 * 2;
    iVar145 = 0;
    piVar123 = dgd_avg;
    do {
      if (0 < (int)(uVar144 + uVar130)) {
        lVar127 = 0;
        do {
          auVar147 = vpmovzxbw_avx2(*(undefined1 (*) [16])(puVar120 + lVar127));
          auVar147 = vpsubw_avx2(auVar147,auVar148);
          *(undefined1 (*) [32])(piVar123 + lVar127) = auVar147;
          lVar127 = lVar127 + 0x10;
        } while (lVar127 < (int)(uVar144 + uVar130));
      }
      puVar120 = puVar120 + dgd_stride;
      iVar145 = iVar145 + 1;
      piVar123 = piVar123 + lVar137;
    } while (iVar145 != iVar143);
    if (wiener_win == 5) {
      uVar130 = uVar144 & 0xfffffff0;
      uVar144 = uVar144 & 0xf;
      auVar147 = *(undefined1 (*) [32])(mask_16bit + (0x10 - uVar144));
      lVar140 = (long)(int)uVar130;
      local_280 = 0;
      lVar127 = 0;
      do {
        local_1c0 = 0;
        uStack_1b8 = 0;
        uStack_1b0 = 0;
        uStack_1a8 = 0;
        local_1e0 = 0;
        uStack_1d8 = 0;
        uStack_1d0 = 0;
        uStack_1c8 = 0;
        local_200 = 0;
        uStack_1f8 = 0;
        uStack_1f0 = 0;
        uStack_1e8 = 0;
        local_220 = 0;
        uStack_218 = 0;
        uStack_210 = 0;
        uStack_208 = 0;
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        local_c0 = 0;
        uStack_b8 = 0;
        uStack_b0 = 0;
        uStack_a8 = 0;
        local_e0 = 0;
        uStack_d8 = 0;
        uStack_d0 = 0;
        uStack_c8 = 0;
        local_100 = 0;
        uStack_f8 = 0;
        uStack_f0 = 0;
        uStack_e8 = 0;
        local_120 = 0;
        uStack_118 = 0;
        uStack_110 = 0;
        uStack_108 = 0;
        local_140 = 0;
        uStack_138 = 0;
        uStack_130 = 0;
        uStack_128 = 0;
        piVar123 = src_avg;
        piVar129 = dgd_avg;
        iVar145 = v_start;
        iVar143 = iVar119;
        do {
          iVar134 = v_end - iVar145;
          if (3 < v_end - iVar145) {
            iVar134 = iVar143;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar134 = iVar143;
          }
          iVar143 = iVar134;
          auVar165._0_2_ = (undefined2)iVar143;
          auVar165._2_2_ = auVar165._0_2_;
          auVar165._4_2_ = auVar165._0_2_;
          auVar165._6_2_ = auVar165._0_2_;
          auVar165._8_2_ = auVar165._0_2_;
          auVar165._10_2_ = auVar165._0_2_;
          auVar165._12_2_ = auVar165._0_2_;
          auVar165._14_2_ = auVar165._0_2_;
          auVar165._16_2_ = auVar165._0_2_;
          auVar165._18_2_ = auVar165._0_2_;
          auVar165._20_2_ = auVar165._0_2_;
          auVar165._22_2_ = auVar165._0_2_;
          auVar165._24_2_ = auVar165._0_2_;
          auVar165._26_2_ = auVar165._0_2_;
          auVar165._28_2_ = auVar165._0_2_;
          auVar165._30_2_ = auVar165._0_2_;
          if ((int)uVar130 < 1) {
            uVar142 = 0;
          }
          else {
            pauVar124 = (undefined1 (*) [32])(local_280 + (long)piVar129);
            uVar142 = 0;
            do {
              auVar148 = vpmullw_avx2(auVar165,*(undefined1 (*) [32])(piVar123 + uVar142));
              auVar1 = vpmullw_avx2(auVar165,*(undefined1 (*) [32])(piVar129 + uVar142));
              lVar121 = 0;
              pauVar125 = pauVar124;
              do {
                auVar5 = *pauVar125;
                auVar6 = vpmaddwd_avx2(auVar148,auVar5);
                auVar6 = vpaddd_avx2(auVar6,*(undefined1 (*) [32])(local_240 + lVar121));
                *(undefined1 (*) [32])(local_240 + lVar121) = auVar6;
                auVar5 = vpmaddwd_avx2(auVar1,auVar5);
                auVar5 = vpaddd_avx2(auVar5,*(undefined1 (*) [32])((long)&local_140 + lVar121));
                *(undefined1 (*) [32])((long)&local_140 + lVar121) = auVar5;
                lVar121 = lVar121 + 0x20;
                pauVar125 = (undefined1 (*) [32])(*pauVar125 + lVar126);
              } while (lVar121 != 0xa0);
              uVar142 = uVar142 + 0x10;
              pauVar124 = pauVar124 + 1;
            } while ((long)uVar142 < lVar140);
            uVar142 = uVar142 & 0xffffffff;
          }
          if (uVar144 != 0) {
            auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar123 + uVar142));
            auVar1 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar129 + uVar142));
            auVar148 = vpmullw_avx2(auVar165,auVar148);
            auVar165 = vpmullw_avx2(auVar165,auVar1);
            pauVar124 = (undefined1 (*) [32])
                        (*(undefined1 (*) [32])(piVar129 + uVar142) + local_280);
            lVar121 = 0;
            do {
              auVar1 = *pauVar124;
              auVar5 = vpmaddwd_avx2(auVar148,auVar1);
              auVar5 = vpaddd_avx2(auVar5,*(undefined1 (*) [32])(local_240 + lVar121));
              *(undefined1 (*) [32])(local_240 + lVar121) = auVar5;
              auVar1 = vpmaddwd_avx2(auVar165,auVar1);
              auVar1 = vpaddd_avx2(auVar1,*(undefined1 (*) [32])((long)&local_140 + lVar121));
              *(undefined1 (*) [32])((long)&local_140 + lVar121) = auVar1;
              lVar121 = lVar121 + 0x20;
              pauVar124 = (undefined1 (*) [32])(*pauVar124 + lVar126);
            } while (lVar121 != 0xa0);
          }
          iVar145 = iVar145 + iVar143;
          piVar123 = piVar123 + (int)(iVar143 * uVar131);
          piVar129 = piVar129 + (int)(iVar143 * uVar139);
        } while (iVar145 < v_end);
        auVar5._8_8_ = uStack_1f8;
        auVar5._0_8_ = local_200;
        auVar5._16_8_ = uStack_1f0;
        auVar5._24_8_ = uStack_1e8;
        auVar1._8_8_ = uStack_218;
        auVar1._0_8_ = local_220;
        auVar1._16_8_ = uStack_210;
        auVar1._24_8_ = uStack_208;
        auVar148 = vphaddd_avx2(local_240,auVar1);
        auVar6._8_8_ = uStack_1d8;
        auVar6._0_8_ = local_1e0;
        auVar6._16_8_ = uStack_1d0;
        auVar6._24_8_ = uStack_1c8;
        auVar165 = vphaddd_avx2(auVar5,auVar6);
        auVar148 = vphaddd_avx2(auVar148,auVar165);
        auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
        auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
        auVar149._8_8_ = uStack_1b8;
        auVar149._0_8_ = local_1c0;
        auVar1 = vpmovsxdq_avx2(auVar149);
        auVar148 = vpaddq_avx2(auVar165,auVar148);
        auVar4._8_8_ = uStack_1a8;
        auVar4._0_8_ = uStack_1b0;
        auVar165 = vpmovsxdq_avx2(auVar4);
        auVar165 = vpaddq_avx2(auVar1,auVar165);
        auVar114._8_8_ = uStack_b8;
        auVar114._0_8_ = local_c0;
        auVar1 = vpmovsxdq_avx2(auVar114);
        auVar116._8_8_ = uStack_a8;
        auVar116._0_8_ = uStack_b0;
        auVar5 = vpmovsxdq_avx2(auVar116);
        auVar1 = vpaddq_avx2(auVar1,auVar5);
        auVar5 = vpunpcklqdq_avx2(auVar165,auVar1);
        auVar165 = vpunpckhqdq_avx2(auVar165,auVar1);
        auVar165 = vpaddq_avx2(auVar5,auVar165);
        auVar149 = vpaddq_avx(auVar165._0_16_,auVar165._16_16_);
        *(undefined1 (*) [32])(M + lVar127 * 5) = auVar148;
        M[lVar127 * 5 + 4] = auVar149._0_8_;
        auVar107._8_8_ = uStack_138;
        auVar107._0_8_ = local_140;
        auVar107._16_8_ = uStack_130;
        auVar107._24_8_ = uStack_128;
        auVar111._8_8_ = uStack_f8;
        auVar111._0_8_ = local_100;
        auVar111._16_8_ = uStack_f0;
        auVar111._24_8_ = uStack_e8;
        auVar109._8_8_ = uStack_118;
        auVar109._0_8_ = local_120;
        auVar109._16_8_ = uStack_110;
        auVar109._24_8_ = uStack_108;
        auVar148 = vphaddd_avx2(auVar107,auVar109);
        auVar113._8_8_ = uStack_d8;
        auVar113._0_8_ = local_e0;
        auVar113._16_8_ = uStack_d0;
        auVar113._24_8_ = uStack_c8;
        auVar165 = vphaddd_avx2(auVar111,auVar113);
        auVar148 = vphaddd_avx2(auVar148,auVar165);
        auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
        auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
        auVar148 = vpaddq_avx2(auVar165,auVar148);
        *(undefined1 (*) [32])(H + lVar127 * 5) = auVar148;
        iVar2 = vpextrq_avx(auVar149,1);
        H[lVar127 * 5 + 4] = iVar2;
        lVar127 = lVar127 + 1;
        local_280 = local_280 + 2;
      } while (lVar127 != 5);
      uVar142 = 1;
      local_268 = 2;
      uVar135 = 0;
      do {
        uVar131 = 3;
        if (3 < (uint)uVar135) {
          uVar131 = (uint)uVar135;
        }
        piVar123 = dgd_avg + uVar142 / 5;
        piVar129 = piVar123 + lVar137;
        local_1c0 = 0;
        uStack_1b8 = 0;
        uStack_1b0 = 0;
        uStack_1a8 = 0;
        local_1e0 = 0;
        uStack_1d8 = 0;
        uStack_1d0 = 0;
        uStack_1c8 = 0;
        local_200 = 0;
        uStack_1f8 = 0;
        uStack_1f0 = 0;
        uStack_1e8 = 0;
        local_220 = 0;
        uStack_218 = 0;
        uStack_210 = 0;
        uStack_208 = 0;
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        piVar122 = piVar129;
        iVar145 = v_start;
        iVar143 = iVar119;
        do {
          iVar134 = v_end - iVar145;
          if (3 < v_end - iVar145) {
            iVar134 = iVar143;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar134 = iVar143;
          }
          iVar143 = iVar134;
          auVar166._0_2_ = (undefined2)iVar143;
          auVar166._2_2_ = auVar166._0_2_;
          auVar166._4_2_ = auVar166._0_2_;
          auVar166._6_2_ = auVar166._0_2_;
          auVar166._8_2_ = auVar166._0_2_;
          auVar166._10_2_ = auVar166._0_2_;
          auVar166._12_2_ = auVar166._0_2_;
          auVar166._14_2_ = auVar166._0_2_;
          auVar166._16_2_ = auVar166._0_2_;
          auVar166._18_2_ = auVar166._0_2_;
          auVar166._20_2_ = auVar166._0_2_;
          auVar166._22_2_ = auVar166._0_2_;
          auVar166._24_2_ = auVar166._0_2_;
          auVar166._26_2_ = auVar166._0_2_;
          auVar166._28_2_ = auVar166._0_2_;
          auVar166._30_2_ = auVar166._0_2_;
          if ((int)uVar130 < 1) {
            uVar138 = 0;
          }
          else {
            pauVar124 = (undefined1 (*) [32])(piVar123 + lVar137);
            uVar138 = 0;
            do {
              auVar148 = vpmullw_avx2(auVar166,*(undefined1 (*) [32])(piVar122 + uVar138));
              lVar127 = 0;
              pauVar125 = pauVar124;
              do {
                auVar165 = vpmaddwd_avx2(auVar148,*pauVar125);
                auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar127));
                *(undefined1 (*) [32])(local_240 + lVar127) = auVar165;
                lVar127 = lVar127 + 0x20;
                pauVar125 = (undefined1 (*) [32])(*pauVar125 + lVar126);
              } while (lVar127 != 0x80);
              uVar138 = uVar138 + 0x10;
              pauVar124 = pauVar124 + 1;
            } while ((long)uVar138 < lVar140);
            uVar138 = uVar138 & 0xffffffff;
          }
          if (uVar144 != 0) {
            auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar122 + uVar138));
            auVar148 = vpmullw_avx2(auVar166,auVar148);
            pauVar124 = (undefined1 (*) [32])(piVar123 + uVar138 + lVar137);
            lVar127 = 0;
            do {
              auVar165 = vpmaddwd_avx2(auVar148,*pauVar124);
              auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar127));
              *(undefined1 (*) [32])(local_240 + lVar127) = auVar165;
              lVar127 = lVar127 + 0x20;
              pauVar124 = (undefined1 (*) [32])(*pauVar124 + lVar126);
            } while (lVar127 != 0x80);
          }
          iVar145 = iVar145 + iVar143;
          piVar123 = piVar123 + (int)(iVar143 * uVar139);
          piVar122 = piVar122 + (int)(iVar143 * uVar139);
        } while (iVar145 < v_end);
        auVar42._8_8_ = uStack_1f8;
        auVar42._0_8_ = local_200;
        auVar42._16_8_ = uStack_1f0;
        auVar42._24_8_ = uStack_1e8;
        auVar22._8_8_ = uStack_218;
        auVar22._0_8_ = local_220;
        auVar22._16_8_ = uStack_210;
        auVar22._24_8_ = uStack_208;
        auVar148 = vphaddd_avx2(local_240,auVar22);
        auVar60._8_8_ = uStack_1d8;
        auVar60._0_8_ = local_1e0;
        auVar60._16_8_ = uStack_1d0;
        auVar60._24_8_ = uStack_1c8;
        auVar165 = vphaddd_avx2(auVar42,auVar60);
        auVar148 = vphaddd_avx2(auVar148,auVar165);
        auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
        auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
        auVar148 = vpaddq_avx2(auVar165,auVar148);
        *(undefined1 (*) [32])(H + uVar142 * 0x1a) = auVar148;
        if (uVar142 < 0x14) {
          lVar127 = local_268;
          uVar138 = uVar135;
          do {
            uVar138 = uVar138 + 1;
            local_1c0 = 0;
            uStack_1b8 = 0;
            uStack_1b0 = 0;
            uStack_1a8 = 0;
            local_1e0 = 0;
            uStack_1d8 = 0;
            uStack_1d0 = 0;
            uStack_1c8 = 0;
            local_200 = 0;
            uStack_1f8 = 0;
            uStack_1f0 = 0;
            uStack_1e8 = 0;
            local_220 = 0;
            uStack_218 = 0;
            uStack_210 = 0;
            uStack_208 = 0;
            local_240._0_16_ = ZEXT816(0);
            local_240 = ZEXT1632(local_240._0_16_);
            piVar122 = piVar129;
            piVar123 = dgd_avg;
            iVar145 = v_start;
            iVar143 = iVar119;
            do {
              iVar134 = v_end - iVar145;
              if (3 < v_end - iVar145) {
                iVar134 = iVar143;
              }
              if (use_downsampled_wiener_stats == 0) {
                iVar134 = iVar143;
              }
              iVar143 = iVar134;
              auVar167._0_2_ = (undefined2)iVar143;
              auVar167._2_2_ = auVar167._0_2_;
              auVar167._4_2_ = auVar167._0_2_;
              auVar167._6_2_ = auVar167._0_2_;
              auVar167._8_2_ = auVar167._0_2_;
              auVar167._10_2_ = auVar167._0_2_;
              auVar167._12_2_ = auVar167._0_2_;
              auVar167._14_2_ = auVar167._0_2_;
              auVar167._16_2_ = auVar167._0_2_;
              auVar167._18_2_ = auVar167._0_2_;
              auVar167._20_2_ = auVar167._0_2_;
              auVar167._22_2_ = auVar167._0_2_;
              auVar167._24_2_ = auVar167._0_2_;
              auVar167._26_2_ = auVar167._0_2_;
              auVar167._28_2_ = auVar167._0_2_;
              auVar167._30_2_ = auVar167._0_2_;
              if ((int)uVar130 < 1) {
                uVar128 = 0;
              }
              else {
                pauVar124 = (undefined1 (*) [32])((long)piVar123 + lVar127);
                uVar128 = 0;
                do {
                  auVar148 = vpmullw_avx2(auVar167,*(undefined1 (*) [32])(piVar122 + uVar128));
                  lVar121 = 0;
                  pauVar125 = pauVar124;
                  do {
                    auVar165 = vpmaddwd_avx2(auVar148,*pauVar125);
                    auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar121));
                    *(undefined1 (*) [32])(local_240 + lVar121) = auVar165;
                    lVar121 = lVar121 + 0x20;
                    pauVar125 = (undefined1 (*) [32])(*pauVar125 + lVar126);
                  } while (lVar121 != 0xa0);
                  uVar128 = uVar128 + 0x10;
                  pauVar124 = pauVar124 + 1;
                } while ((long)uVar128 < lVar140);
                uVar128 = uVar128 & 0xffffffff;
              }
              if (uVar144 != 0) {
                auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar122 + uVar128));
                auVar148 = vpmullw_avx2(auVar167,auVar148);
                pauVar124 = (undefined1 (*) [32])((long)piVar123 + uVar128 * 2 + lVar127);
                lVar121 = 0;
                do {
                  auVar165 = vpmaddwd_avx2(auVar148,*pauVar124);
                  auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar121));
                  *(undefined1 (*) [32])(local_240 + lVar121) = auVar165;
                  lVar121 = lVar121 + 0x20;
                  pauVar124 = (undefined1 (*) [32])(*pauVar124 + lVar126);
                } while (lVar121 != 0xa0);
              }
              iVar145 = iVar145 + iVar143;
              piVar123 = piVar123 + (int)(iVar143 * uVar139);
              piVar122 = piVar122 + (int)(iVar143 * uVar139);
            } while (iVar145 < v_end);
            auVar43._8_8_ = uStack_1f8;
            auVar43._0_8_ = local_200;
            auVar43._16_8_ = uStack_1f0;
            auVar43._24_8_ = uStack_1e8;
            auVar23._8_8_ = uStack_218;
            auVar23._0_8_ = local_220;
            auVar23._16_8_ = uStack_210;
            auVar23._24_8_ = uStack_208;
            auVar148 = vphaddd_avx2(local_240,auVar23);
            auVar61._8_8_ = uStack_1d8;
            auVar61._0_8_ = local_1e0;
            auVar61._16_8_ = uStack_1d0;
            auVar61._24_8_ = uStack_1c8;
            auVar165 = vphaddd_avx2(auVar43,auVar61);
            auVar148 = vphaddd_avx2(auVar148,auVar165);
            auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
            auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
            auVar148 = vpaddq_avx2(auVar165,auVar148);
            *(undefined1 (*) [32])(H + uVar142 * 0x19 + uVar138 * 5) = auVar148;
            auVar68._8_8_ = uStack_1b8;
            auVar68._0_8_ = local_1c0;
            auVar148 = vpmovsxdq_avx2(auVar68);
            auVar83._8_8_ = uStack_1a8;
            auVar83._0_8_ = uStack_1b0;
            auVar165 = vpmovsxdq_avx2(auVar83);
            auVar148 = vpaddq_avx2(auVar148,auVar165);
            auVar165 = vpshufd_avx2(auVar148,0x44);
            auVar148 = vpshufd_avx2(auVar148,0xee);
            auVar148 = vpaddq_avx2(auVar165,auVar148);
            auVar149 = vpaddq_avx(auVar148._0_16_,auVar148._16_16_);
            H[uVar142 * 0x19 + uVar138 * 5 + 4] = auVar149._0_8_;
            lVar127 = lVar127 + 2;
          } while (uVar138 != uVar131 + 1);
        }
        uVar142 = uVar142 + 5;
        uVar135 = uVar135 + 1;
        local_268 = local_268 + 2;
      } while (uVar135 != 5);
      lVar137 = (long)(int)(uVar139 * 2);
      uVar142 = 2;
      local_268 = 2;
      uVar135 = 0;
      do {
        uVar131 = 3;
        if (3 < (uint)uVar135) {
          uVar131 = (uint)uVar135;
        }
        piVar123 = dgd_avg + uVar142 / 5;
        piVar129 = piVar123 + lVar137;
        local_1c0 = 0;
        uStack_1b8 = 0;
        uStack_1b0 = 0;
        uStack_1a8 = 0;
        local_1e0 = 0;
        uStack_1d8 = 0;
        uStack_1d0 = 0;
        uStack_1c8 = 0;
        local_200 = 0;
        uStack_1f8 = 0;
        uStack_1f0 = 0;
        uStack_1e8 = 0;
        local_220 = 0;
        uStack_218 = 0;
        uStack_210 = 0;
        uStack_208 = 0;
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        piVar122 = piVar129;
        iVar145 = v_start;
        iVar143 = iVar119;
        do {
          iVar134 = v_end - iVar145;
          if (3 < v_end - iVar145) {
            iVar134 = iVar143;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar134 = iVar143;
          }
          iVar143 = iVar134;
          auVar168._0_2_ = (undefined2)iVar143;
          auVar168._2_2_ = auVar168._0_2_;
          auVar168._4_2_ = auVar168._0_2_;
          auVar168._6_2_ = auVar168._0_2_;
          auVar168._8_2_ = auVar168._0_2_;
          auVar168._10_2_ = auVar168._0_2_;
          auVar168._12_2_ = auVar168._0_2_;
          auVar168._14_2_ = auVar168._0_2_;
          auVar168._16_2_ = auVar168._0_2_;
          auVar168._18_2_ = auVar168._0_2_;
          auVar168._20_2_ = auVar168._0_2_;
          auVar168._22_2_ = auVar168._0_2_;
          auVar168._24_2_ = auVar168._0_2_;
          auVar168._26_2_ = auVar168._0_2_;
          auVar168._28_2_ = auVar168._0_2_;
          auVar168._30_2_ = auVar168._0_2_;
          if ((int)uVar130 < 1) {
            uVar138 = 0;
          }
          else {
            pauVar124 = (undefined1 (*) [32])(piVar123 + lVar137);
            uVar138 = 0;
            do {
              auVar148 = vpmullw_avx2(auVar168,*(undefined1 (*) [32])(piVar122 + uVar138));
              lVar127 = 0;
              pauVar125 = pauVar124;
              do {
                auVar165 = vpmaddwd_avx2(auVar148,*pauVar125);
                auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar127));
                *(undefined1 (*) [32])(local_240 + lVar127) = auVar165;
                lVar127 = lVar127 + 0x20;
                pauVar125 = (undefined1 (*) [32])(*pauVar125 + lVar126);
              } while (lVar127 != 0x60);
              uVar138 = uVar138 + 0x10;
              pauVar124 = pauVar124 + 1;
            } while ((long)uVar138 < lVar140);
            uVar138 = uVar138 & 0xffffffff;
          }
          if (uVar144 != 0) {
            auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar122 + uVar138));
            auVar148 = vpmullw_avx2(auVar168,auVar148);
            pauVar124 = (undefined1 (*) [32])(piVar123 + uVar138 + lVar137);
            lVar127 = 0;
            do {
              auVar165 = vpmaddwd_avx2(auVar148,*pauVar124);
              auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar127));
              *(undefined1 (*) [32])(local_240 + lVar127) = auVar165;
              lVar127 = lVar127 + 0x20;
              pauVar124 = (undefined1 (*) [32])(*pauVar124 + lVar126);
            } while (lVar127 != 0x60);
          }
          iVar145 = iVar145 + iVar143;
          piVar123 = piVar123 + (int)(iVar143 * uVar139);
          piVar122 = piVar122 + (int)(iVar143 * uVar139);
        } while (iVar145 < v_end);
        auVar44._8_8_ = uStack_1f8;
        auVar44._0_8_ = local_200;
        auVar44._16_8_ = uStack_1f0;
        auVar44._24_8_ = uStack_1e8;
        auVar24._8_8_ = uStack_218;
        auVar24._0_8_ = local_220;
        auVar24._16_8_ = uStack_210;
        auVar24._24_8_ = uStack_208;
        auVar148 = vphaddd_avx2(local_240,auVar24);
        auVar165 = vphaddd_avx2(auVar44,ZEXT1632(ZEXT816(0)));
        auVar148 = vphaddd_avx2(auVar148,auVar165);
        auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
        auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
        auVar148 = vpaddq_avx2(auVar165,auVar148);
        *(undefined1 (*) [32])(H + uVar142 * 0x1a) = auVar148;
        if (uVar142 < 0x14) {
          lVar127 = local_268;
          uVar138 = uVar135;
          do {
            uVar138 = uVar138 + 1;
            local_1c0 = 0;
            uStack_1b8 = 0;
            uStack_1b0 = 0;
            uStack_1a8 = 0;
            local_1e0 = 0;
            uStack_1d8 = 0;
            uStack_1d0 = 0;
            uStack_1c8 = 0;
            local_200 = 0;
            uStack_1f8 = 0;
            uStack_1f0 = 0;
            uStack_1e8 = 0;
            local_220 = 0;
            uStack_218 = 0;
            uStack_210 = 0;
            uStack_208 = 0;
            local_240._0_16_ = ZEXT816(0);
            local_240 = ZEXT1632(local_240._0_16_);
            piVar122 = piVar129;
            piVar123 = dgd_avg;
            iVar145 = v_start;
            iVar143 = iVar119;
            do {
              iVar134 = v_end - iVar145;
              if (3 < v_end - iVar145) {
                iVar134 = iVar143;
              }
              if (use_downsampled_wiener_stats == 0) {
                iVar134 = iVar143;
              }
              iVar143 = iVar134;
              auVar169._0_2_ = (undefined2)iVar143;
              auVar169._2_2_ = auVar169._0_2_;
              auVar169._4_2_ = auVar169._0_2_;
              auVar169._6_2_ = auVar169._0_2_;
              auVar169._8_2_ = auVar169._0_2_;
              auVar169._10_2_ = auVar169._0_2_;
              auVar169._12_2_ = auVar169._0_2_;
              auVar169._14_2_ = auVar169._0_2_;
              auVar169._16_2_ = auVar169._0_2_;
              auVar169._18_2_ = auVar169._0_2_;
              auVar169._20_2_ = auVar169._0_2_;
              auVar169._22_2_ = auVar169._0_2_;
              auVar169._24_2_ = auVar169._0_2_;
              auVar169._26_2_ = auVar169._0_2_;
              auVar169._28_2_ = auVar169._0_2_;
              auVar169._30_2_ = auVar169._0_2_;
              if ((int)uVar130 < 1) {
                uVar128 = 0;
              }
              else {
                pauVar124 = (undefined1 (*) [32])((long)piVar123 + lVar127);
                uVar128 = 0;
                do {
                  auVar148 = vpmullw_avx2(auVar169,*(undefined1 (*) [32])(piVar122 + uVar128));
                  lVar121 = 0;
                  pauVar125 = pauVar124;
                  do {
                    auVar165 = vpmaddwd_avx2(auVar148,*pauVar125);
                    auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar121));
                    *(undefined1 (*) [32])(local_240 + lVar121) = auVar165;
                    lVar121 = lVar121 + 0x20;
                    pauVar125 = (undefined1 (*) [32])(*pauVar125 + lVar126);
                  } while (lVar121 != 0xa0);
                  uVar128 = uVar128 + 0x10;
                  pauVar124 = pauVar124 + 1;
                } while ((long)uVar128 < lVar140);
                uVar128 = uVar128 & 0xffffffff;
              }
              if (uVar144 != 0) {
                auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar122 + uVar128));
                auVar148 = vpmullw_avx2(auVar169,auVar148);
                pauVar124 = (undefined1 (*) [32])((long)piVar123 + uVar128 * 2 + lVar127);
                lVar121 = 0;
                do {
                  auVar165 = vpmaddwd_avx2(auVar148,*pauVar124);
                  auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar121));
                  *(undefined1 (*) [32])(local_240 + lVar121) = auVar165;
                  lVar121 = lVar121 + 0x20;
                  pauVar124 = (undefined1 (*) [32])(*pauVar124 + lVar126);
                } while (lVar121 != 0xa0);
              }
              iVar145 = iVar145 + iVar143;
              piVar123 = piVar123 + (int)(iVar143 * uVar139);
              piVar122 = piVar122 + (int)(iVar143 * uVar139);
            } while (iVar145 < v_end);
            auVar45._8_8_ = uStack_1f8;
            auVar45._0_8_ = local_200;
            auVar45._16_8_ = uStack_1f0;
            auVar45._24_8_ = uStack_1e8;
            auVar25._8_8_ = uStack_218;
            auVar25._0_8_ = local_220;
            auVar25._16_8_ = uStack_210;
            auVar25._24_8_ = uStack_208;
            auVar148 = vphaddd_avx2(local_240,auVar25);
            auVar62._8_8_ = uStack_1d8;
            auVar62._0_8_ = local_1e0;
            auVar62._16_8_ = uStack_1d0;
            auVar62._24_8_ = uStack_1c8;
            auVar165 = vphaddd_avx2(auVar45,auVar62);
            auVar148 = vphaddd_avx2(auVar148,auVar165);
            auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
            auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
            auVar148 = vpaddq_avx2(auVar165,auVar148);
            *(undefined1 (*) [32])(H + uVar142 * 0x19 + uVar138 * 5) = auVar148;
            auVar69._8_8_ = uStack_1b8;
            auVar69._0_8_ = local_1c0;
            auVar148 = vpmovsxdq_avx2(auVar69);
            auVar84._8_8_ = uStack_1a8;
            auVar84._0_8_ = uStack_1b0;
            auVar165 = vpmovsxdq_avx2(auVar84);
            auVar148 = vpaddq_avx2(auVar148,auVar165);
            auVar165 = vpshufd_avx2(auVar148,0x44);
            auVar148 = vpshufd_avx2(auVar148,0xee);
            auVar148 = vpaddq_avx2(auVar165,auVar148);
            auVar149 = vpaddq_avx(auVar148._0_16_,auVar148._16_16_);
            H[uVar142 * 0x19 + uVar138 * 5 + 4] = auVar149._0_8_;
            lVar127 = lVar127 + 2;
          } while (uVar138 != uVar131 + 1);
        }
        uVar142 = uVar142 + 5;
        uVar135 = uVar135 + 1;
        local_268 = local_268 + 2;
      } while (uVar135 != 5);
      lVar137 = (long)(int)(uVar139 * 3);
      uVar142 = 3;
      local_268 = 2;
      uVar135 = 0;
      do {
        uVar131 = 3;
        if (3 < (uint)uVar135) {
          uVar131 = (uint)uVar135;
        }
        piVar123 = dgd_avg + uVar142 / 5;
        piVar129 = piVar123 + lVar137;
        local_1c0 = 0;
        uStack_1b8 = 0;
        uStack_1b0 = 0;
        uStack_1a8 = 0;
        local_1e0 = 0;
        uStack_1d8 = 0;
        uStack_1d0 = 0;
        uStack_1c8 = 0;
        local_200 = 0;
        uStack_1f8 = 0;
        uStack_1f0 = 0;
        uStack_1e8 = 0;
        local_220 = 0;
        uStack_218 = 0;
        uStack_210 = 0;
        uStack_208 = 0;
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        piVar122 = piVar129;
        iVar145 = v_start;
        iVar143 = iVar119;
        do {
          iVar134 = v_end - iVar145;
          if (3 < v_end - iVar145) {
            iVar134 = iVar143;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar134 = iVar143;
          }
          iVar143 = iVar134;
          auVar170._0_2_ = (undefined2)iVar143;
          auVar170._2_2_ = auVar170._0_2_;
          auVar170._4_2_ = auVar170._0_2_;
          auVar170._6_2_ = auVar170._0_2_;
          auVar170._8_2_ = auVar170._0_2_;
          auVar170._10_2_ = auVar170._0_2_;
          auVar170._12_2_ = auVar170._0_2_;
          auVar170._14_2_ = auVar170._0_2_;
          auVar170._16_2_ = auVar170._0_2_;
          auVar170._18_2_ = auVar170._0_2_;
          auVar170._20_2_ = auVar170._0_2_;
          auVar170._22_2_ = auVar170._0_2_;
          auVar170._24_2_ = auVar170._0_2_;
          auVar170._26_2_ = auVar170._0_2_;
          auVar170._28_2_ = auVar170._0_2_;
          auVar170._30_2_ = auVar170._0_2_;
          if ((int)uVar130 < 1) {
            uVar138 = 0;
          }
          else {
            pauVar124 = (undefined1 (*) [32])(piVar123 + lVar137);
            uVar138 = 0;
            do {
              auVar148 = vpmullw_avx2(auVar170,*(undefined1 (*) [32])(piVar122 + uVar138));
              lVar127 = 0;
              pauVar125 = pauVar124;
              do {
                auVar165 = vpmaddwd_avx2(auVar148,*pauVar125);
                auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar127));
                *(undefined1 (*) [32])(local_240 + lVar127) = auVar165;
                lVar127 = lVar127 + 0x20;
                pauVar125 = (undefined1 (*) [32])(*pauVar125 + lVar126);
              } while (lVar127 == 0x20);
              uVar138 = uVar138 + 0x10;
              pauVar124 = pauVar124 + 1;
            } while ((long)uVar138 < lVar140);
            uVar138 = uVar138 & 0xffffffff;
          }
          if (uVar144 != 0) {
            auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar122 + uVar138));
            auVar148 = vpmullw_avx2(auVar170,auVar148);
            pauVar124 = (undefined1 (*) [32])(piVar123 + uVar138 + lVar137);
            lVar127 = 0;
            do {
              auVar165 = vpmaddwd_avx2(auVar148,*pauVar124);
              auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar127));
              *(undefined1 (*) [32])(local_240 + lVar127) = auVar165;
              lVar127 = lVar127 + 0x20;
              pauVar124 = (undefined1 (*) [32])(*pauVar124 + lVar126);
            } while (lVar127 == 0x20);
          }
          iVar145 = iVar145 + iVar143;
          piVar123 = piVar123 + (int)(iVar143 * uVar139);
          piVar122 = piVar122 + (int)(iVar143 * uVar139);
        } while (iVar145 < v_end);
        auVar148 = vpmovsxdq_avx2(local_240._0_16_);
        auVar165 = vpmovsxdq_avx2(local_240._16_16_);
        auVar148 = vpaddq_avx2(auVar148,auVar165);
        auVar8._8_8_ = uStack_218;
        auVar8._0_8_ = local_220;
        auVar165 = vpmovsxdq_avx2(auVar8);
        auVar29._8_8_ = uStack_208;
        auVar29._0_8_ = uStack_210;
        auVar1 = vpmovsxdq_avx2(auVar29);
        auVar165 = vpaddq_avx2(auVar165,auVar1);
        auVar1 = vpunpcklqdq_avx2(auVar148,auVar165);
        auVar148 = vpunpckhqdq_avx2(auVar148,auVar165);
        auVar148 = vpaddq_avx2(auVar1,auVar148);
        auVar149 = vpaddq_avx(auVar148._0_16_,auVar148._16_16_);
        *(undefined1 (*) [16])(H + uVar142 * 0x1a) = auVar149;
        if (uVar142 < 0x14) {
          lVar127 = local_268;
          uVar138 = uVar135;
          do {
            uVar138 = uVar138 + 1;
            local_1c0 = 0;
            uStack_1b8 = 0;
            uStack_1b0 = 0;
            uStack_1a8 = 0;
            local_1e0 = 0;
            uStack_1d8 = 0;
            uStack_1d0 = 0;
            uStack_1c8 = 0;
            local_200 = 0;
            uStack_1f8 = 0;
            uStack_1f0 = 0;
            uStack_1e8 = 0;
            local_220 = 0;
            uStack_218 = 0;
            uStack_210 = 0;
            uStack_208 = 0;
            local_240._0_16_ = ZEXT816(0);
            local_240 = ZEXT1632(local_240._0_16_);
            piVar122 = piVar129;
            piVar123 = dgd_avg;
            iVar145 = v_start;
            iVar143 = iVar119;
            do {
              iVar134 = v_end - iVar145;
              if (3 < v_end - iVar145) {
                iVar134 = iVar143;
              }
              if (use_downsampled_wiener_stats == 0) {
                iVar134 = iVar143;
              }
              iVar143 = iVar134;
              auVar171._0_2_ = (undefined2)iVar143;
              auVar171._2_2_ = auVar171._0_2_;
              auVar171._4_2_ = auVar171._0_2_;
              auVar171._6_2_ = auVar171._0_2_;
              auVar171._8_2_ = auVar171._0_2_;
              auVar171._10_2_ = auVar171._0_2_;
              auVar171._12_2_ = auVar171._0_2_;
              auVar171._14_2_ = auVar171._0_2_;
              auVar171._16_2_ = auVar171._0_2_;
              auVar171._18_2_ = auVar171._0_2_;
              auVar171._20_2_ = auVar171._0_2_;
              auVar171._22_2_ = auVar171._0_2_;
              auVar171._24_2_ = auVar171._0_2_;
              auVar171._26_2_ = auVar171._0_2_;
              auVar171._28_2_ = auVar171._0_2_;
              auVar171._30_2_ = auVar171._0_2_;
              if ((int)uVar130 < 1) {
                uVar128 = 0;
              }
              else {
                pauVar124 = (undefined1 (*) [32])((long)piVar123 + lVar127);
                uVar128 = 0;
                do {
                  auVar148 = vpmullw_avx2(auVar171,*(undefined1 (*) [32])(piVar122 + uVar128));
                  lVar121 = 0;
                  pauVar125 = pauVar124;
                  do {
                    auVar165 = vpmaddwd_avx2(auVar148,*pauVar125);
                    auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar121));
                    *(undefined1 (*) [32])(local_240 + lVar121) = auVar165;
                    lVar121 = lVar121 + 0x20;
                    pauVar125 = (undefined1 (*) [32])(*pauVar125 + lVar126);
                  } while (lVar121 != 0xa0);
                  uVar128 = uVar128 + 0x10;
                  pauVar124 = pauVar124 + 1;
                } while ((long)uVar128 < lVar140);
                uVar128 = uVar128 & 0xffffffff;
              }
              if (uVar144 != 0) {
                auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar122 + uVar128));
                auVar148 = vpmullw_avx2(auVar171,auVar148);
                pauVar124 = (undefined1 (*) [32])((long)piVar123 + uVar128 * 2 + lVar127);
                lVar121 = 0;
                do {
                  auVar165 = vpmaddwd_avx2(auVar148,*pauVar124);
                  auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar121));
                  *(undefined1 (*) [32])(local_240 + lVar121) = auVar165;
                  lVar121 = lVar121 + 0x20;
                  pauVar124 = (undefined1 (*) [32])(*pauVar124 + lVar126);
                } while (lVar121 != 0xa0);
              }
              iVar145 = iVar145 + iVar143;
              piVar123 = piVar123 + (int)(iVar143 * uVar139);
              piVar122 = piVar122 + (int)(iVar143 * uVar139);
            } while (iVar145 < v_end);
            auVar46._8_8_ = uStack_1f8;
            auVar46._0_8_ = local_200;
            auVar46._16_8_ = uStack_1f0;
            auVar46._24_8_ = uStack_1e8;
            auVar26._8_8_ = uStack_218;
            auVar26._0_8_ = local_220;
            auVar26._16_8_ = uStack_210;
            auVar26._24_8_ = uStack_208;
            auVar148 = vphaddd_avx2(local_240,auVar26);
            auVar63._8_8_ = uStack_1d8;
            auVar63._0_8_ = local_1e0;
            auVar63._16_8_ = uStack_1d0;
            auVar63._24_8_ = uStack_1c8;
            auVar165 = vphaddd_avx2(auVar46,auVar63);
            auVar148 = vphaddd_avx2(auVar148,auVar165);
            auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
            auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
            auVar148 = vpaddq_avx2(auVar165,auVar148);
            *(undefined1 (*) [32])(H + uVar142 * 0x19 + uVar138 * 5) = auVar148;
            auVar70._8_8_ = uStack_1b8;
            auVar70._0_8_ = local_1c0;
            auVar148 = vpmovsxdq_avx2(auVar70);
            auVar85._8_8_ = uStack_1a8;
            auVar85._0_8_ = uStack_1b0;
            auVar165 = vpmovsxdq_avx2(auVar85);
            auVar148 = vpaddq_avx2(auVar148,auVar165);
            auVar165 = vpshufd_avx2(auVar148,0x44);
            auVar148 = vpshufd_avx2(auVar148,0xee);
            auVar148 = vpaddq_avx2(auVar165,auVar148);
            auVar149 = vpaddq_avx(auVar148._0_16_,auVar148._16_16_);
            H[uVar142 * 0x19 + uVar138 * 5 + 4] = auVar149._0_8_;
            lVar127 = lVar127 + 2;
          } while (uVar138 != uVar131 + 1);
        }
        uVar142 = uVar142 + 5;
        uVar135 = uVar135 + 1;
        local_268 = local_268 + 2;
      } while (uVar135 != 5);
      lVar137 = (long)(int)(uVar139 * 4);
      uVar135 = 4;
      local_278 = 2;
      uVar142 = 0;
      do {
        uVar131 = 3;
        if (3 < (uint)uVar142) {
          uVar131 = (uint)uVar142;
        }
        piVar123 = dgd_avg + uVar135 / 5;
        piVar129 = piVar123 + lVar137;
        auVar150 = ZEXT1664((undefined1  [16])0x0);
        piVar122 = piVar129;
        iVar145 = v_start;
        iVar143 = iVar119;
        do {
          iVar134 = v_end - iVar145;
          if (3 < v_end - iVar145) {
            iVar134 = iVar143;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar134 = iVar143;
          }
          iVar143 = iVar134;
          auVar177._0_2_ = (undefined2)iVar143;
          auVar177._2_2_ = auVar177._0_2_;
          auVar177._4_2_ = auVar177._0_2_;
          auVar177._6_2_ = auVar177._0_2_;
          auVar177._8_2_ = auVar177._0_2_;
          auVar177._10_2_ = auVar177._0_2_;
          auVar177._12_2_ = auVar177._0_2_;
          auVar177._14_2_ = auVar177._0_2_;
          auVar177._16_2_ = auVar177._0_2_;
          auVar177._18_2_ = auVar177._0_2_;
          auVar177._20_2_ = auVar177._0_2_;
          auVar177._22_2_ = auVar177._0_2_;
          auVar177._24_2_ = auVar177._0_2_;
          auVar177._26_2_ = auVar177._0_2_;
          auVar177._28_2_ = auVar177._0_2_;
          auVar177._30_2_ = auVar177._0_2_;
          if ((int)uVar130 < 1) {
            lVar127 = 0;
          }
          else {
            lVar127 = 0;
            do {
              auVar148 = vpmullw_avx2(auVar177,*(undefined1 (*) [32])(piVar122 + lVar127));
              auVar148 = vpmaddwd_avx2(auVar148,*(undefined1 (*) [32])(piVar123 + lVar137 + lVar127)
                                      );
              auVar148 = vpaddd_avx2(auVar148,auVar150._0_32_);
              auVar150 = ZEXT3264(auVar148);
              lVar127 = lVar127 + 0x10;
            } while (lVar127 < lVar140);
          }
          if (uVar144 != 0) {
            auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar122 + lVar127));
            auVar148 = vpmullw_avx2(auVar177,auVar148);
            auVar148 = vpmaddwd_avx2(auVar148,*(undefined1 (*) [32])(piVar123 + lVar127 + lVar137));
            auVar148 = vpaddd_avx2(auVar148,auVar150._0_32_);
            auVar150 = ZEXT3264(auVar148);
          }
          iVar145 = iVar145 + iVar143;
          piVar123 = piVar123 + (int)(iVar143 * uVar139);
          piVar122 = piVar122 + (int)(iVar143 * uVar139);
        } while (iVar145 < v_end);
        auVar148 = vpmovsxdq_avx2(auVar150._0_16_);
        auVar165 = vpmovsxdq_avx2(auVar150._16_16_);
        auVar148 = vpaddq_avx2(auVar148,auVar165);
        auVar165 = vpmovsxdq_avx2(ZEXT816(0));
        auVar1 = vpmovsxdq_avx2(ZEXT816(0));
        auVar165 = vpaddq_avx2(auVar165,auVar1);
        auVar1 = vpunpcklqdq_avx2(auVar148,auVar165);
        auVar148 = vpunpckhqdq_avx2(auVar148,auVar165);
        auVar148 = vpaddq_avx2(auVar1,auVar148);
        auVar149 = vpaddq_avx(auVar148._0_16_,auVar148._16_16_);
        *(undefined1 (*) [16])(H + uVar135 * 0x1a) = auVar149;
        if (uVar135 < 0x14) {
          lVar127 = local_278;
          uVar138 = uVar142;
          do {
            uVar138 = uVar138 + 1;
            local_1c0 = 0;
            uStack_1b8 = 0;
            uStack_1b0 = 0;
            uStack_1a8 = 0;
            local_1e0 = 0;
            uStack_1d8 = 0;
            uStack_1d0 = 0;
            uStack_1c8 = 0;
            local_200 = 0;
            uStack_1f8 = 0;
            uStack_1f0 = 0;
            uStack_1e8 = 0;
            local_220 = 0;
            uStack_218 = 0;
            uStack_210 = 0;
            uStack_208 = 0;
            local_240._0_16_ = ZEXT816(0);
            local_240 = ZEXT1632(local_240._0_16_);
            piVar122 = piVar129;
            piVar123 = dgd_avg;
            iVar145 = v_start;
            iVar143 = iVar119;
            do {
              iVar134 = v_end - iVar145;
              if (3 < v_end - iVar145) {
                iVar134 = iVar143;
              }
              if (use_downsampled_wiener_stats == 0) {
                iVar134 = iVar143;
              }
              iVar143 = iVar134;
              auVar172._0_2_ = (undefined2)iVar143;
              auVar172._2_2_ = auVar172._0_2_;
              auVar172._4_2_ = auVar172._0_2_;
              auVar172._6_2_ = auVar172._0_2_;
              auVar172._8_2_ = auVar172._0_2_;
              auVar172._10_2_ = auVar172._0_2_;
              auVar172._12_2_ = auVar172._0_2_;
              auVar172._14_2_ = auVar172._0_2_;
              auVar172._16_2_ = auVar172._0_2_;
              auVar172._18_2_ = auVar172._0_2_;
              auVar172._20_2_ = auVar172._0_2_;
              auVar172._22_2_ = auVar172._0_2_;
              auVar172._24_2_ = auVar172._0_2_;
              auVar172._26_2_ = auVar172._0_2_;
              auVar172._28_2_ = auVar172._0_2_;
              auVar172._30_2_ = auVar172._0_2_;
              if ((int)uVar130 < 1) {
                uVar128 = 0;
              }
              else {
                pauVar124 = (undefined1 (*) [32])((long)piVar123 + lVar127);
                uVar128 = 0;
                do {
                  auVar148 = vpmullw_avx2(auVar172,*(undefined1 (*) [32])(piVar122 + uVar128));
                  lVar121 = 0;
                  pauVar125 = pauVar124;
                  do {
                    auVar165 = vpmaddwd_avx2(auVar148,*pauVar125);
                    auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar121));
                    *(undefined1 (*) [32])(local_240 + lVar121) = auVar165;
                    lVar121 = lVar121 + 0x20;
                    pauVar125 = (undefined1 (*) [32])(*pauVar125 + lVar126);
                  } while (lVar121 != 0xa0);
                  uVar128 = uVar128 + 0x10;
                  pauVar124 = pauVar124 + 1;
                } while ((long)uVar128 < lVar140);
                uVar128 = uVar128 & 0xffffffff;
              }
              if (uVar144 != 0) {
                auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar122 + uVar128));
                auVar148 = vpmullw_avx2(auVar172,auVar148);
                pauVar124 = (undefined1 (*) [32])((long)piVar123 + uVar128 * 2 + lVar127);
                lVar121 = 0;
                do {
                  auVar165 = vpmaddwd_avx2(auVar148,*pauVar124);
                  auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar121));
                  *(undefined1 (*) [32])(local_240 + lVar121) = auVar165;
                  lVar121 = lVar121 + 0x20;
                  pauVar124 = (undefined1 (*) [32])(*pauVar124 + lVar126);
                } while (lVar121 != 0xa0);
              }
              iVar145 = iVar145 + iVar143;
              piVar123 = piVar123 + (int)(iVar143 * uVar139);
              piVar122 = piVar122 + (int)(iVar143 * uVar139);
            } while (iVar145 < v_end);
            auVar47._8_8_ = uStack_1f8;
            auVar47._0_8_ = local_200;
            auVar47._16_8_ = uStack_1f0;
            auVar47._24_8_ = uStack_1e8;
            auVar27._8_8_ = uStack_218;
            auVar27._0_8_ = local_220;
            auVar27._16_8_ = uStack_210;
            auVar27._24_8_ = uStack_208;
            auVar148 = vphaddd_avx2(local_240,auVar27);
            auVar64._8_8_ = uStack_1d8;
            auVar64._0_8_ = local_1e0;
            auVar64._16_8_ = uStack_1d0;
            auVar64._24_8_ = uStack_1c8;
            auVar165 = vphaddd_avx2(auVar47,auVar64);
            auVar148 = vphaddd_avx2(auVar148,auVar165);
            auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
            auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
            auVar148 = vpaddq_avx2(auVar165,auVar148);
            *(undefined1 (*) [32])(H + uVar135 * 0x19 + uVar138 * 5) = auVar148;
            auVar71._8_8_ = uStack_1b8;
            auVar71._0_8_ = local_1c0;
            auVar148 = vpmovsxdq_avx2(auVar71);
            auVar86._8_8_ = uStack_1a8;
            auVar86._0_8_ = uStack_1b0;
            auVar165 = vpmovsxdq_avx2(auVar86);
            auVar148 = vpaddq_avx2(auVar148,auVar165);
            auVar165 = vpshufd_avx2(auVar148,0x44);
            auVar148 = vpshufd_avx2(auVar148,0xee);
            auVar148 = vpaddq_avx2(auVar165,auVar148);
            auVar149 = vpaddq_avx(auVar148._0_16_,auVar148._16_16_);
            H[uVar135 * 0x19 + uVar138 * 5 + 4] = auVar149._0_8_;
            lVar127 = lVar127 + 2;
          } while (uVar138 != uVar131 + 1);
        }
        uVar135 = uVar135 + 5;
        uVar142 = uVar142 + 1;
        local_278 = local_278 + 2;
      } while (uVar142 != 5);
      lVar137 = 1;
      local_290 = 4;
      uVar142 = 5;
      do {
        lVar136 = 0;
        lVar121 = 0;
        lVar127 = lVar137;
        do {
          local_1c0 = 0;
          uStack_1b8 = 0;
          uStack_1b0 = 0;
          uStack_1a8 = 0;
          local_1e0 = 0;
          uStack_1d8 = 0;
          uStack_1d0 = 0;
          uStack_1c8 = 0;
          local_200 = 0;
          uStack_1f8 = 0;
          uStack_1f0 = 0;
          uStack_1e8 = 0;
          local_220 = 0;
          uStack_218 = 0;
          uStack_210 = 0;
          uStack_208 = 0;
          local_240._0_16_ = ZEXT816(0);
          local_240 = ZEXT1632(local_240._0_16_);
          piVar123 = dgd_avg + uVar142 / 5;
          piVar129 = dgd_avg + uVar142 / 5;
          iVar145 = v_start;
          iVar143 = iVar119;
          do {
            iVar134 = v_end - iVar145;
            if (3 < v_end - iVar145) {
              iVar134 = iVar143;
            }
            if (use_downsampled_wiener_stats == 0) {
              iVar134 = iVar143;
            }
            iVar143 = iVar134;
            auVar173._0_2_ = (undefined2)iVar143;
            auVar173._2_2_ = auVar173._0_2_;
            auVar173._4_2_ = auVar173._0_2_;
            auVar173._6_2_ = auVar173._0_2_;
            auVar173._8_2_ = auVar173._0_2_;
            auVar173._10_2_ = auVar173._0_2_;
            auVar173._12_2_ = auVar173._0_2_;
            auVar173._14_2_ = auVar173._0_2_;
            auVar173._16_2_ = auVar173._0_2_;
            auVar173._18_2_ = auVar173._0_2_;
            auVar173._20_2_ = auVar173._0_2_;
            auVar173._22_2_ = auVar173._0_2_;
            auVar173._24_2_ = auVar173._0_2_;
            auVar173._26_2_ = auVar173._0_2_;
            auVar173._28_2_ = auVar173._0_2_;
            auVar173._30_2_ = auVar173._0_2_;
            if ((int)uVar130 < 1) {
              uVar135 = 0;
            }
            else {
              pauVar124 = (undefined1 (*) [32])((long)piVar123 + lVar136);
              uVar135 = 0;
              do {
                auVar148 = vpmullw_avx2(auVar173,*(undefined1 (*) [32])(piVar129 + uVar135));
                lVar132 = 0;
                pauVar125 = pauVar124;
                do {
                  auVar165 = vpmaddwd_avx2(auVar148,*pauVar125);
                  auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar132));
                  *(undefined1 (*) [32])(local_240 + lVar132) = auVar165;
                  lVar132 = lVar132 + 0x20;
                  pauVar125 = (undefined1 (*) [32])(*pauVar125 + lVar126);
                } while (lVar132 != 0xa0);
                uVar135 = uVar135 + 0x10;
                pauVar124 = pauVar124 + 1;
              } while ((long)uVar135 < lVar140);
              uVar135 = uVar135 & 0xffffffff;
            }
            if (uVar144 != 0) {
              auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar129 + uVar135));
              auVar148 = vpmullw_avx2(auVar173,auVar148);
              pauVar124 = (undefined1 (*) [32])((long)piVar123 + uVar135 * 2 + lVar136);
              lVar132 = 0;
              do {
                auVar165 = vpmaddwd_avx2(auVar148,*pauVar124);
                auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar132));
                *(undefined1 (*) [32])(local_240 + lVar132) = auVar165;
                lVar132 = lVar132 + 0x20;
                pauVar124 = (undefined1 (*) [32])(*pauVar124 + lVar126);
              } while (lVar132 != 0xa0);
            }
            iVar145 = iVar145 + iVar143;
            piVar123 = piVar123 + (int)(iVar143 * uVar139);
            piVar129 = piVar129 + (int)(iVar143 * uVar139);
          } while (iVar145 < v_end);
          auVar48._8_8_ = uStack_1f8;
          auVar48._0_8_ = local_200;
          auVar48._16_8_ = uStack_1f0;
          auVar48._24_8_ = uStack_1e8;
          auVar28._8_8_ = uStack_218;
          auVar28._0_8_ = local_220;
          auVar28._16_8_ = uStack_210;
          auVar28._24_8_ = uStack_208;
          auVar148 = vphaddd_avx2(local_240,auVar28);
          auVar65._8_8_ = uStack_1d8;
          auVar65._0_8_ = local_1e0;
          auVar65._16_8_ = uStack_1d0;
          auVar65._24_8_ = uStack_1c8;
          auVar165 = vphaddd_avx2(auVar48,auVar65);
          auVar148 = vphaddd_avx2(auVar148,auVar165);
          auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
          auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
          auVar148 = vpaddq_avx2(auVar165,auVar148);
          *(undefined1 (*) [32])(H + uVar142 * 0x19 + lVar127 * 5) = auVar148;
          auVar72._8_8_ = uStack_1b8;
          auVar72._0_8_ = local_1c0;
          auVar148 = vpmovsxdq_avx2(auVar72);
          auVar87._8_8_ = uStack_1a8;
          auVar87._0_8_ = uStack_1b0;
          auVar165 = vpmovsxdq_avx2(auVar87);
          auVar148 = vpaddq_avx2(auVar148,auVar165);
          auVar165 = vpshufd_avx2(auVar148,0x44);
          auVar148 = vpshufd_avx2(auVar148,0xee);
          auVar148 = vpaddq_avx2(auVar165,auVar148);
          auVar149 = vpaddq_avx(auVar148._0_16_,auVar148._16_16_);
          H[uVar142 * 0x19 + lVar127 * 5 + 4] = auVar149._0_8_;
          lVar121 = lVar121 + 1;
          lVar127 = lVar127 + 1;
          lVar136 = lVar136 + 2;
        } while (lVar121 != local_290);
        uVar142 = uVar142 + 5;
        lVar137 = lVar137 + 1;
        local_290 = local_290 + -1;
      } while (lVar137 != 5);
      pauVar124 = (undefined1 (*) [32])(H + 0x7d);
      pauVar125 = (undefined1 (*) [32])(H + 5);
      uVar135 = 1;
      uVar142 = 0;
      do {
        auVar147 = vpunpcklqdq_avx2(*(undefined1 (*) [32])(H + uVar142 * 0x1a + 1),
                                    *(undefined1 (*) [32])(H + uVar142 * 0x1a + 0x1a));
        auVar148 = vpunpcklqdq_avx2(*(undefined1 (*) [32])(H + uVar142 * 0x1a + 0x33),
                                    *(undefined1 (*) [32])(H + uVar142 * 0x1a + 0x4c));
        auVar165 = vperm2i128_avx2(auVar147,auVar148,0x31);
        auVar147 = vpunpckhqdq_avx2(*(undefined1 (*) [32])(H + uVar142 * 0x1a + 1),
                                    *(undefined1 (*) [32])(H + uVar142 * 0x1a + 0x1a));
        auVar148 = vpunpckhqdq_avx2(*(undefined1 (*) [32])(H + uVar142 * 0x1a + 0x33),
                                    *(undefined1 (*) [32])(H + uVar142 * 0x1a + 0x4c));
        auVar148 = vperm2i128_avx2(auVar147,auVar148,0x31);
        H[uVar142 * 0x1a + 0x19] = H[uVar142 * 0x1a + 1];
        *(undefined1 (*) [16])(H + uVar142 * 0x1a + 0x32) = auVar147._0_16_;
        *(undefined1 (*) [32])(H + uVar142 * 0x1a + 0x4b) = auVar165;
        *(undefined1 (*) [32])(H + uVar142 * 0x1a + 100) = auVar148;
        pauVar133 = pauVar124;
        pauVar141 = pauVar125;
        uVar138 = uVar135;
        if (uVar142 < 0x14) {
          do {
            auVar165 = vpunpcklqdq_avx2(*pauVar141,*(undefined1 (*) [32])(pauVar141[6] + 8));
            auVar1 = vpunpcklqdq_avx2(*(undefined1 (*) [32])(pauVar141[0xc] + 0x10),
                                      *(undefined1 (*) [32])(pauVar141[0x12] + 0x18));
            auVar147 = vpunpckhqdq_avx2(*pauVar141,*(undefined1 (*) [32])(pauVar141[6] + 8));
            auVar148 = vpunpckhqdq_avx2(*(undefined1 (*) [32])(pauVar141[0xc] + 0x10),
                                        *(undefined1 (*) [32])(pauVar141[0x12] + 0x18));
            auVar174._0_16_ = ZEXT116(0) * auVar1._0_16_ + ZEXT116(1) * auVar165._0_16_;
            auVar174._16_16_ = ZEXT116(0) * auVar165._16_16_ + ZEXT116(1) * auVar1._0_16_;
            auVar178._0_16_ = ZEXT116(0) * auVar148._0_16_ + ZEXT116(1) * auVar147._0_16_;
            auVar178._16_16_ = ZEXT116(0) * auVar147._16_16_ + ZEXT116(1) * auVar148._0_16_;
            auVar165 = vperm2i128_avx2(auVar165,auVar1,0x31);
            auVar147 = vperm2i128_avx2(auVar147,auVar148,0x31);
            *pauVar133 = auVar174;
            *(undefined1 (*) [32])(pauVar133[6] + 8) = auVar178;
            *(undefined1 (*) [32])(pauVar133[0xc] + 0x10) = auVar165;
            *(undefined1 (*) [32])(pauVar133[0x12] + 0x18) = auVar147;
            uVar138 = uVar138 + 4;
            pauVar133 = pauVar133 + 0x19;
            pauVar141 = pauVar141 + 1;
          } while (uVar138 < 0x15);
        }
        uVar135 = uVar135 + 4;
        pauVar124 = pauVar124 + 0x1a;
        pauVar125 = pauVar125 + 0x1a;
        bVar3 = uVar142 < 0x14;
        uVar142 = uVar142 + 4;
      } while (bVar3);
    }
    else if (wiener_win == 7) {
      uVar130 = uVar144 & 0xfffffff0;
      uVar144 = uVar144 & 0xf;
      auVar147 = *(undefined1 (*) [32])(mask_16bit + (0x10 - uVar144));
      lVar140 = (long)(int)uVar130;
      local_280 = 0;
      lVar127 = 0;
      do {
        local_180 = 0;
        uStack_178 = 0;
        uStack_170 = 0;
        uStack_168 = 0;
        local_1a0 = 0;
        uStack_198 = 0;
        uStack_190 = 0;
        uStack_188 = 0;
        local_1c0 = 0;
        uStack_1b8 = 0;
        uStack_1b0 = 0;
        uStack_1a8 = 0;
        local_1e0 = 0;
        uStack_1d8 = 0;
        uStack_1d0 = 0;
        uStack_1c8 = 0;
        local_200 = 0;
        uStack_1f8 = 0;
        uStack_1f0 = 0;
        uStack_1e8 = 0;
        local_220 = 0;
        uStack_218 = 0;
        uStack_210 = 0;
        uStack_208 = 0;
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        local_80 = 0;
        uStack_78 = 0;
        uStack_70 = 0;
        uStack_68 = 0;
        local_a0 = 0;
        uStack_98 = 0;
        uStack_90 = 0;
        uStack_88 = 0;
        local_c0 = 0;
        uStack_b8 = 0;
        uStack_b0 = 0;
        uStack_a8 = 0;
        local_e0 = 0;
        uStack_d8 = 0;
        uStack_d0 = 0;
        uStack_c8 = 0;
        local_100 = 0;
        uStack_f8 = 0;
        uStack_f0 = 0;
        uStack_e8 = 0;
        local_120 = 0;
        uStack_118 = 0;
        uStack_110 = 0;
        uStack_108 = 0;
        local_140 = 0;
        uStack_138 = 0;
        uStack_130 = 0;
        uStack_128 = 0;
        piVar123 = src_avg;
        piVar129 = dgd_avg;
        iVar145 = v_start;
        iVar143 = iVar119;
        do {
          iVar134 = v_end - iVar145;
          if (3 < v_end - iVar145) {
            iVar134 = iVar143;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar134 = iVar143;
          }
          iVar143 = iVar134;
          auVar151._0_2_ = (undefined2)iVar143;
          auVar151._2_2_ = auVar151._0_2_;
          auVar151._4_2_ = auVar151._0_2_;
          auVar151._6_2_ = auVar151._0_2_;
          auVar151._8_2_ = auVar151._0_2_;
          auVar151._10_2_ = auVar151._0_2_;
          auVar151._12_2_ = auVar151._0_2_;
          auVar151._14_2_ = auVar151._0_2_;
          auVar151._16_2_ = auVar151._0_2_;
          auVar151._18_2_ = auVar151._0_2_;
          auVar151._20_2_ = auVar151._0_2_;
          auVar151._22_2_ = auVar151._0_2_;
          auVar151._24_2_ = auVar151._0_2_;
          auVar151._26_2_ = auVar151._0_2_;
          auVar151._28_2_ = auVar151._0_2_;
          auVar151._30_2_ = auVar151._0_2_;
          if ((int)uVar130 < 1) {
            uVar142 = 0;
          }
          else {
            pauVar124 = (undefined1 (*) [32])(local_280 + (long)piVar129);
            uVar142 = 0;
            do {
              auVar148 = vpmullw_avx2(auVar151,*(undefined1 (*) [32])(piVar123 + uVar142));
              auVar165 = vpmullw_avx2(auVar151,*(undefined1 (*) [32])(piVar129 + uVar142));
              lVar121 = 0;
              pauVar125 = pauVar124;
              do {
                auVar1 = *pauVar125;
                auVar5 = vpmaddwd_avx2(auVar148,auVar1);
                auVar5 = vpaddd_avx2(auVar5,*(undefined1 (*) [32])(local_240 + lVar121));
                *(undefined1 (*) [32])(local_240 + lVar121) = auVar5;
                auVar1 = vpmaddwd_avx2(auVar165,auVar1);
                auVar1 = vpaddd_avx2(auVar1,*(undefined1 (*) [32])((long)&local_140 + lVar121));
                *(undefined1 (*) [32])((long)&local_140 + lVar121) = auVar1;
                lVar121 = lVar121 + 0x20;
                pauVar125 = (undefined1 (*) [32])(*pauVar125 + lVar126);
              } while (lVar121 != 0xe0);
              uVar142 = uVar142 + 0x10;
              pauVar124 = pauVar124 + 1;
            } while ((long)uVar142 < lVar140);
            uVar142 = uVar142 & 0xffffffff;
          }
          if (uVar144 != 0) {
            auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar123 + uVar142));
            auVar165 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar129 + uVar142));
            auVar148 = vpmullw_avx2(auVar151,auVar148);
            auVar165 = vpmullw_avx2(auVar151,auVar165);
            pauVar124 = (undefined1 (*) [32])
                        (*(undefined1 (*) [32])(piVar129 + uVar142) + local_280);
            lVar121 = 0;
            do {
              auVar1 = *pauVar124;
              auVar5 = vpmaddwd_avx2(auVar148,auVar1);
              auVar5 = vpaddd_avx2(auVar5,*(undefined1 (*) [32])(local_240 + lVar121));
              *(undefined1 (*) [32])(local_240 + lVar121) = auVar5;
              auVar1 = vpmaddwd_avx2(auVar165,auVar1);
              auVar1 = vpaddd_avx2(auVar1,*(undefined1 (*) [32])((long)&local_140 + lVar121));
              *(undefined1 (*) [32])((long)&local_140 + lVar121) = auVar1;
              lVar121 = lVar121 + 0x20;
              pauVar124 = (undefined1 (*) [32])(*pauVar124 + lVar126);
            } while (lVar121 != 0xe0);
          }
          iVar145 = iVar145 + iVar143;
          piVar123 = piVar123 + (int)(iVar143 * uVar131);
          piVar129 = piVar129 + (int)(iVar143 * uVar139);
        } while (iVar145 < v_end);
        auVar30._8_8_ = uStack_1f8;
        auVar30._0_8_ = local_200;
        auVar30._16_8_ = uStack_1f0;
        auVar30._24_8_ = uStack_1e8;
        auVar9._8_8_ = uStack_218;
        auVar9._0_8_ = local_220;
        auVar9._16_8_ = uStack_210;
        auVar9._24_8_ = uStack_208;
        auVar148 = vphaddd_avx2(local_240,auVar9);
        auVar49._8_8_ = uStack_1d8;
        auVar49._0_8_ = local_1e0;
        auVar49._16_8_ = uStack_1d0;
        auVar49._24_8_ = uStack_1c8;
        auVar165 = vphaddd_avx2(auVar30,auVar49);
        auVar73._8_8_ = uStack_1b8;
        auVar73._0_8_ = local_1c0;
        auVar73._16_8_ = uStack_1b0;
        auVar73._24_8_ = uStack_1a8;
        auVar148 = vphaddd_avx2(auVar148,auVar165);
        auVar98._8_8_ = uStack_178;
        auVar98._0_8_ = local_180;
        auVar98._16_8_ = uStack_170;
        auVar98._24_8_ = uStack_168;
        auVar1 = vpmovsxdq_avx2(auVar148._0_16_);
        auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
        auVar89._8_8_ = uStack_198;
        auVar89._0_8_ = local_1a0;
        auVar89._16_8_ = uStack_190;
        auVar89._24_8_ = uStack_188;
        auVar165 = vphaddd_avx2(auVar73,auVar89);
        auVar148 = vpaddq_avx2(auVar1,auVar148);
        auVar1 = vphaddd_avx2(auVar98,auVar98);
        auVar165 = vphaddd_avx2(auVar165,auVar1);
        auVar1 = vpmovsxdq_avx2(auVar165._0_16_);
        auVar165 = vpmovsxdq_avx2(auVar165._16_16_);
        auVar165 = vpaddq_avx2(auVar1,auVar165);
        *(undefined1 (*) [32])(M + lVar127 * 7) = auVar148;
        *(undefined1 (*) [16])(M + lVar127 * 7 + 4) = auVar165._0_16_;
        M[lVar127 * 7 + 6] = auVar165._16_8_;
        auVar106._8_8_ = uStack_138;
        auVar106._0_8_ = local_140;
        auVar106._16_8_ = uStack_130;
        auVar106._24_8_ = uStack_128;
        auVar110._8_8_ = uStack_f8;
        auVar110._0_8_ = local_100;
        auVar110._16_8_ = uStack_f0;
        auVar110._24_8_ = uStack_e8;
        auVar115._8_8_ = uStack_b8;
        auVar115._0_8_ = local_c0;
        auVar115._16_8_ = uStack_b0;
        auVar115._24_8_ = uStack_a8;
        auVar118._8_8_ = uStack_78;
        auVar118._0_8_ = local_80;
        auVar118._16_8_ = uStack_70;
        auVar118._24_8_ = uStack_68;
        auVar108._8_8_ = uStack_118;
        auVar108._0_8_ = local_120;
        auVar108._16_8_ = uStack_110;
        auVar108._24_8_ = uStack_108;
        auVar148 = vphaddd_avx2(auVar106,auVar108);
        auVar112._8_8_ = uStack_d8;
        auVar112._0_8_ = local_e0;
        auVar112._16_8_ = uStack_d0;
        auVar112._24_8_ = uStack_c8;
        auVar165 = vphaddd_avx2(auVar110,auVar112);
        auVar148 = vphaddd_avx2(auVar148,auVar165);
        auVar5 = vpmovsxdq_avx2(auVar148._0_16_);
        auVar117._8_8_ = uStack_98;
        auVar117._0_8_ = local_a0;
        auVar117._16_8_ = uStack_90;
        auVar117._24_8_ = uStack_88;
        auVar165 = vphaddd_avx2(auVar115,auVar117);
        auVar1 = vphaddd_avx2(auVar118,auVar118);
        auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
        auVar165 = vphaddd_avx2(auVar165,auVar1);
        auVar148 = vpaddq_avx2(auVar5,auVar148);
        auVar1 = vpmovsxdq_avx2(auVar165._0_16_);
        auVar165 = vpmovsxdq_avx2(auVar165._16_16_);
        auVar165 = vpaddq_avx2(auVar1,auVar165);
        *(undefined1 (*) [32])(H + lVar127 * 7) = auVar148;
        *(undefined1 (*) [16])(H + lVar127 * 7 + 4) = auVar165._0_16_;
        H[lVar127 * 7 + 6] = auVar165._16_8_;
        lVar127 = lVar127 + 1;
        local_280 = local_280 + 2;
      } while (lVar127 != 7);
      uVar135 = 1;
      local_268 = 2;
      uVar142 = 0;
      do {
        uVar131 = 5;
        if (5 < (uint)uVar142) {
          uVar131 = (uint)uVar142;
        }
        piVar123 = dgd_avg + uVar135 / 7;
        piVar129 = piVar123 + lVar137;
        local_180 = 0;
        uStack_178 = 0;
        uStack_170 = 0;
        uStack_168 = 0;
        local_1a0 = 0;
        uStack_198 = 0;
        uStack_190 = 0;
        uStack_188 = 0;
        local_1c0 = 0;
        uStack_1b8 = 0;
        uStack_1b0 = 0;
        uStack_1a8 = 0;
        local_1e0 = 0;
        uStack_1d8 = 0;
        uStack_1d0 = 0;
        uStack_1c8 = 0;
        local_200 = 0;
        uStack_1f8 = 0;
        uStack_1f0 = 0;
        uStack_1e8 = 0;
        local_220 = 0;
        uStack_218 = 0;
        uStack_210 = 0;
        uStack_208 = 0;
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        piVar122 = piVar129;
        iVar145 = v_start;
        iVar143 = iVar119;
        do {
          iVar134 = v_end - iVar145;
          if (3 < v_end - iVar145) {
            iVar134 = iVar143;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar134 = iVar143;
          }
          iVar143 = iVar134;
          auVar152._0_2_ = (undefined2)iVar143;
          auVar152._2_2_ = auVar152._0_2_;
          auVar152._4_2_ = auVar152._0_2_;
          auVar152._6_2_ = auVar152._0_2_;
          auVar152._8_2_ = auVar152._0_2_;
          auVar152._10_2_ = auVar152._0_2_;
          auVar152._12_2_ = auVar152._0_2_;
          auVar152._14_2_ = auVar152._0_2_;
          auVar152._16_2_ = auVar152._0_2_;
          auVar152._18_2_ = auVar152._0_2_;
          auVar152._20_2_ = auVar152._0_2_;
          auVar152._22_2_ = auVar152._0_2_;
          auVar152._24_2_ = auVar152._0_2_;
          auVar152._26_2_ = auVar152._0_2_;
          auVar152._28_2_ = auVar152._0_2_;
          auVar152._30_2_ = auVar152._0_2_;
          if ((int)uVar130 < 1) {
            uVar138 = 0;
          }
          else {
            pauVar124 = (undefined1 (*) [32])(piVar123 + lVar137);
            uVar138 = 0;
            do {
              auVar148 = vpmullw_avx2(auVar152,*(undefined1 (*) [32])(piVar122 + uVar138));
              lVar127 = 0;
              pauVar125 = pauVar124;
              do {
                auVar165 = vpmaddwd_avx2(auVar148,*pauVar125);
                auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar127));
                *(undefined1 (*) [32])(local_240 + lVar127) = auVar165;
                lVar127 = lVar127 + 0x20;
                pauVar125 = (undefined1 (*) [32])(*pauVar125 + lVar126);
              } while (lVar127 != 0xc0);
              uVar138 = uVar138 + 0x10;
              pauVar124 = pauVar124 + 1;
            } while ((long)uVar138 < lVar140);
            uVar138 = uVar138 & 0xffffffff;
          }
          if (uVar144 != 0) {
            auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar122 + uVar138));
            auVar148 = vpmullw_avx2(auVar152,auVar148);
            pauVar124 = (undefined1 (*) [32])(piVar123 + uVar138 + lVar137);
            lVar127 = 0;
            do {
              auVar165 = vpmaddwd_avx2(auVar148,*pauVar124);
              auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar127));
              *(undefined1 (*) [32])(local_240 + lVar127) = auVar165;
              lVar127 = lVar127 + 0x20;
              pauVar124 = (undefined1 (*) [32])(*pauVar124 + lVar126);
            } while (lVar127 != 0xc0);
          }
          iVar145 = iVar145 + iVar143;
          piVar123 = piVar123 + (int)(iVar143 * uVar139);
          piVar122 = piVar122 + (int)(iVar143 * uVar139);
        } while (iVar145 < v_end);
        auVar31._8_8_ = uStack_1f8;
        auVar31._0_8_ = local_200;
        auVar31._16_8_ = uStack_1f0;
        auVar31._24_8_ = uStack_1e8;
        auVar10._8_8_ = uStack_218;
        auVar10._0_8_ = local_220;
        auVar10._16_8_ = uStack_210;
        auVar10._24_8_ = uStack_208;
        auVar148 = vphaddd_avx2(local_240,auVar10);
        auVar50._8_8_ = uStack_1d8;
        auVar50._0_8_ = local_1e0;
        auVar50._16_8_ = uStack_1d0;
        auVar50._24_8_ = uStack_1c8;
        auVar165 = vphaddd_avx2(auVar31,auVar50);
        auVar148 = vphaddd_avx2(auVar148,auVar165);
        auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
        auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
        auVar148 = vpaddq_avx2(auVar165,auVar148);
        *(undefined1 (*) [32])(H + uVar135 * 0x32) = auVar148;
        auVar66._8_8_ = uStack_1b8;
        auVar66._0_8_ = local_1c0;
        auVar148 = vpmovsxdq_avx2(auVar66);
        auVar81._8_8_ = uStack_1a8;
        auVar81._0_8_ = uStack_1b0;
        auVar165 = vpmovsxdq_avx2(auVar81);
        auVar148 = vpaddq_avx2(auVar148,auVar165);
        auVar88._8_8_ = uStack_198;
        auVar88._0_8_ = local_1a0;
        auVar165 = vpmovsxdq_avx2(auVar88);
        auVar97._8_8_ = uStack_188;
        auVar97._0_8_ = uStack_190;
        auVar1 = vpmovsxdq_avx2(auVar97);
        auVar165 = vpaddq_avx2(auVar165,auVar1);
        auVar1 = vpunpcklqdq_avx2(auVar148,auVar165);
        auVar148 = vpunpckhqdq_avx2(auVar148,auVar165);
        auVar148 = vpaddq_avx2(auVar1,auVar148);
        auVar149 = vpaddq_avx(auVar148._0_16_,auVar148._16_16_);
        *(undefined1 (*) [16])(H + uVar135 * 0x32 + 4) = auVar149;
        if (uVar135 < 0x2a) {
          lVar127 = local_268;
          uVar138 = uVar142;
          do {
            uVar138 = uVar138 + 1;
            local_180 = 0;
            uStack_178 = 0;
            uStack_170 = 0;
            uStack_168 = 0;
            local_1a0 = 0;
            uStack_198 = 0;
            uStack_190 = 0;
            uStack_188 = 0;
            local_1c0 = 0;
            uStack_1b8 = 0;
            uStack_1b0 = 0;
            uStack_1a8 = 0;
            local_1e0 = 0;
            uStack_1d8 = 0;
            uStack_1d0 = 0;
            uStack_1c8 = 0;
            local_200 = 0;
            uStack_1f8 = 0;
            uStack_1f0 = 0;
            uStack_1e8 = 0;
            local_220 = 0;
            uStack_218 = 0;
            uStack_210 = 0;
            uStack_208 = 0;
            local_240._0_16_ = ZEXT816(0);
            local_240 = ZEXT1632(local_240._0_16_);
            piVar122 = piVar129;
            piVar123 = dgd_avg;
            iVar145 = v_start;
            iVar143 = iVar119;
            do {
              iVar134 = v_end - iVar145;
              if (3 < v_end - iVar145) {
                iVar134 = iVar143;
              }
              if (use_downsampled_wiener_stats == 0) {
                iVar134 = iVar143;
              }
              iVar143 = iVar134;
              auVar153._0_2_ = (undefined2)iVar143;
              auVar153._2_2_ = auVar153._0_2_;
              auVar153._4_2_ = auVar153._0_2_;
              auVar153._6_2_ = auVar153._0_2_;
              auVar153._8_2_ = auVar153._0_2_;
              auVar153._10_2_ = auVar153._0_2_;
              auVar153._12_2_ = auVar153._0_2_;
              auVar153._14_2_ = auVar153._0_2_;
              auVar153._16_2_ = auVar153._0_2_;
              auVar153._18_2_ = auVar153._0_2_;
              auVar153._20_2_ = auVar153._0_2_;
              auVar153._22_2_ = auVar153._0_2_;
              auVar153._24_2_ = auVar153._0_2_;
              auVar153._26_2_ = auVar153._0_2_;
              auVar153._28_2_ = auVar153._0_2_;
              auVar153._30_2_ = auVar153._0_2_;
              if ((int)uVar130 < 1) {
                uVar128 = 0;
              }
              else {
                pauVar124 = (undefined1 (*) [32])((long)piVar123 + lVar127);
                uVar128 = 0;
                do {
                  auVar148 = vpmullw_avx2(auVar153,*(undefined1 (*) [32])(piVar122 + uVar128));
                  lVar121 = 0;
                  pauVar125 = pauVar124;
                  do {
                    auVar165 = vpmaddwd_avx2(auVar148,*pauVar125);
                    auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar121));
                    *(undefined1 (*) [32])(local_240 + lVar121) = auVar165;
                    lVar121 = lVar121 + 0x20;
                    pauVar125 = (undefined1 (*) [32])(*pauVar125 + lVar126);
                  } while (lVar121 != 0xe0);
                  uVar128 = uVar128 + 0x10;
                  pauVar124 = pauVar124 + 1;
                } while ((long)uVar128 < lVar140);
                uVar128 = uVar128 & 0xffffffff;
              }
              if (uVar144 != 0) {
                auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar122 + uVar128));
                auVar148 = vpmullw_avx2(auVar153,auVar148);
                pauVar124 = (undefined1 (*) [32])((long)piVar123 + uVar128 * 2 + lVar127);
                lVar121 = 0;
                do {
                  auVar165 = vpmaddwd_avx2(auVar148,*pauVar124);
                  auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar121));
                  *(undefined1 (*) [32])(local_240 + lVar121) = auVar165;
                  lVar121 = lVar121 + 0x20;
                  pauVar124 = (undefined1 (*) [32])(*pauVar124 + lVar126);
                } while (lVar121 != 0xe0);
              }
              iVar145 = iVar145 + iVar143;
              piVar123 = piVar123 + (int)(iVar143 * uVar139);
              piVar122 = piVar122 + (int)(iVar143 * uVar139);
            } while (iVar145 < v_end);
            auVar32._8_8_ = uStack_1f8;
            auVar32._0_8_ = local_200;
            auVar32._16_8_ = uStack_1f0;
            auVar32._24_8_ = uStack_1e8;
            auVar11._8_8_ = uStack_218;
            auVar11._0_8_ = local_220;
            auVar11._16_8_ = uStack_210;
            auVar11._24_8_ = uStack_208;
            auVar148 = vphaddd_avx2(local_240,auVar11);
            auVar51._8_8_ = uStack_1d8;
            auVar51._0_8_ = local_1e0;
            auVar51._16_8_ = uStack_1d0;
            auVar51._24_8_ = uStack_1c8;
            auVar165 = vphaddd_avx2(auVar32,auVar51);
            auVar148 = vphaddd_avx2(auVar148,auVar165);
            auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
            auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
            auVar148 = vpaddq_avx2(auVar165,auVar148);
            *(undefined1 (*) [32])(H + uVar135 * 0x31 + uVar138 * 7) = auVar148;
            auVar74._8_8_ = uStack_1b8;
            auVar74._0_8_ = local_1c0;
            auVar74._16_8_ = uStack_1b0;
            auVar74._24_8_ = uStack_1a8;
            auVar90._8_8_ = uStack_198;
            auVar90._0_8_ = local_1a0;
            auVar90._16_8_ = uStack_190;
            auVar90._24_8_ = uStack_188;
            auVar148 = vphaddd_avx2(auVar74,auVar90);
            auVar99._8_8_ = uStack_178;
            auVar99._0_8_ = local_180;
            auVar99._16_8_ = uStack_170;
            auVar99._24_8_ = uStack_168;
            auVar165 = vphaddd_avx2(auVar99,auVar99);
            auVar148 = vphaddd_avx2(auVar148,auVar165);
            auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
            auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
            auVar148 = vpaddq_avx2(auVar165,auVar148);
            *(undefined1 (*) [32])(H + uVar135 * 0x31 + uVar138 * 7 + 4) = auVar148;
            lVar127 = lVar127 + 2;
          } while (uVar138 != uVar131 + 1);
        }
        uVar135 = uVar135 + 7;
        uVar142 = uVar142 + 1;
        local_268 = local_268 + 2;
      } while (uVar142 != 7);
      lVar137 = (long)(int)(uVar139 * 2);
      local_268 = 2;
      uVar142 = 0;
      uVar135 = 2;
      do {
        uVar131 = 5;
        if (5 < (uint)uVar142) {
          uVar131 = (uint)uVar142;
        }
        piVar123 = dgd_avg + uVar135 / 7;
        piVar129 = piVar123 + lVar137;
        local_180 = 0;
        uStack_178 = 0;
        uStack_170 = 0;
        uStack_168 = 0;
        local_1a0 = 0;
        uStack_198 = 0;
        uStack_190 = 0;
        uStack_188 = 0;
        local_1c0 = 0;
        uStack_1b8 = 0;
        uStack_1b0 = 0;
        uStack_1a8 = 0;
        local_1e0 = 0;
        uStack_1d8 = 0;
        uStack_1d0 = 0;
        uStack_1c8 = 0;
        local_200 = 0;
        uStack_1f8 = 0;
        uStack_1f0 = 0;
        uStack_1e8 = 0;
        local_220 = 0;
        uStack_218 = 0;
        uStack_210 = 0;
        uStack_208 = 0;
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        piVar122 = piVar129;
        iVar145 = v_start;
        iVar143 = iVar119;
        do {
          iVar134 = v_end - iVar145;
          if (3 < v_end - iVar145) {
            iVar134 = iVar143;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar134 = iVar143;
          }
          iVar143 = iVar134;
          auVar154._0_2_ = (undefined2)iVar143;
          auVar154._2_2_ = auVar154._0_2_;
          auVar154._4_2_ = auVar154._0_2_;
          auVar154._6_2_ = auVar154._0_2_;
          auVar154._8_2_ = auVar154._0_2_;
          auVar154._10_2_ = auVar154._0_2_;
          auVar154._12_2_ = auVar154._0_2_;
          auVar154._14_2_ = auVar154._0_2_;
          auVar154._16_2_ = auVar154._0_2_;
          auVar154._18_2_ = auVar154._0_2_;
          auVar154._20_2_ = auVar154._0_2_;
          auVar154._22_2_ = auVar154._0_2_;
          auVar154._24_2_ = auVar154._0_2_;
          auVar154._26_2_ = auVar154._0_2_;
          auVar154._28_2_ = auVar154._0_2_;
          auVar154._30_2_ = auVar154._0_2_;
          if ((int)uVar130 < 1) {
            uVar138 = 0;
          }
          else {
            pauVar124 = (undefined1 (*) [32])(piVar123 + lVar137);
            uVar138 = 0;
            do {
              auVar148 = vpmullw_avx2(auVar154,*(undefined1 (*) [32])(piVar122 + uVar138));
              lVar127 = 0;
              pauVar125 = pauVar124;
              do {
                auVar165 = vpmaddwd_avx2(auVar148,*pauVar125);
                auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar127));
                *(undefined1 (*) [32])(local_240 + lVar127) = auVar165;
                lVar127 = lVar127 + 0x20;
                pauVar125 = (undefined1 (*) [32])(*pauVar125 + lVar126);
              } while (lVar127 != 0xa0);
              uVar138 = uVar138 + 0x10;
              pauVar124 = pauVar124 + 1;
            } while ((long)uVar138 < lVar140);
            uVar138 = uVar138 & 0xffffffff;
          }
          if (uVar144 != 0) {
            auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar122 + uVar138));
            auVar148 = vpmullw_avx2(auVar154,auVar148);
            pauVar124 = (undefined1 (*) [32])(piVar123 + uVar138 + lVar137);
            lVar127 = 0;
            do {
              auVar165 = vpmaddwd_avx2(auVar148,*pauVar124);
              auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar127));
              *(undefined1 (*) [32])(local_240 + lVar127) = auVar165;
              lVar127 = lVar127 + 0x20;
              pauVar124 = (undefined1 (*) [32])(*pauVar124 + lVar126);
            } while (lVar127 != 0xa0);
          }
          iVar145 = iVar145 + iVar143;
          piVar123 = piVar123 + (int)(iVar143 * uVar139);
          piVar122 = piVar122 + (int)(iVar143 * uVar139);
        } while (iVar145 < v_end);
        auVar33._8_8_ = uStack_1f8;
        auVar33._0_8_ = local_200;
        auVar33._16_8_ = uStack_1f0;
        auVar33._24_8_ = uStack_1e8;
        auVar12._8_8_ = uStack_218;
        auVar12._0_8_ = local_220;
        auVar12._16_8_ = uStack_210;
        auVar12._24_8_ = uStack_208;
        auVar148 = vphaddd_avx2(local_240,auVar12);
        auVar52._8_8_ = uStack_1d8;
        auVar52._0_8_ = local_1e0;
        auVar52._16_8_ = uStack_1d0;
        auVar52._24_8_ = uStack_1c8;
        auVar165 = vphaddd_avx2(auVar33,auVar52);
        auVar148 = vphaddd_avx2(auVar148,auVar165);
        auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
        auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
        auVar148 = vpaddq_avx2(auVar165,auVar148);
        *(undefined1 (*) [32])(H + uVar135 * 0x32) = auVar148;
        auVar67._8_8_ = uStack_1b8;
        auVar67._0_8_ = local_1c0;
        auVar148 = vpmovsxdq_avx2(auVar67);
        auVar82._8_8_ = uStack_1a8;
        auVar82._0_8_ = uStack_1b0;
        auVar165 = vpmovsxdq_avx2(auVar82);
        auVar148 = vpaddq_avx2(auVar148,auVar165);
        auVar165 = vpshufd_avx2(auVar148,0x44);
        auVar148 = vpshufd_avx2(auVar148,0xee);
        auVar148 = vpaddq_avx2(auVar165,auVar148);
        auVar149 = vpaddq_avx(auVar148._0_16_,auVar148._16_16_);
        H[uVar135 * 0x32 + 4] = auVar149._0_8_;
        if (uVar135 < 0x2a) {
          lVar127 = local_268;
          uVar138 = uVar142;
          do {
            uVar138 = uVar138 + 1;
            local_180 = 0;
            uStack_178 = 0;
            uStack_170 = 0;
            uStack_168 = 0;
            local_1a0 = 0;
            uStack_198 = 0;
            uStack_190 = 0;
            uStack_188 = 0;
            local_1c0 = 0;
            uStack_1b8 = 0;
            uStack_1b0 = 0;
            uStack_1a8 = 0;
            local_1e0 = 0;
            uStack_1d8 = 0;
            uStack_1d0 = 0;
            uStack_1c8 = 0;
            local_200 = 0;
            uStack_1f8 = 0;
            uStack_1f0 = 0;
            uStack_1e8 = 0;
            local_220 = 0;
            uStack_218 = 0;
            uStack_210 = 0;
            uStack_208 = 0;
            local_240._0_16_ = ZEXT816(0);
            local_240 = ZEXT1632(local_240._0_16_);
            piVar122 = piVar129;
            piVar123 = dgd_avg;
            iVar145 = v_start;
            iVar143 = iVar119;
            do {
              iVar134 = v_end - iVar145;
              if (3 < v_end - iVar145) {
                iVar134 = iVar143;
              }
              if (use_downsampled_wiener_stats == 0) {
                iVar134 = iVar143;
              }
              iVar143 = iVar134;
              auVar155._0_2_ = (undefined2)iVar143;
              auVar155._2_2_ = auVar155._0_2_;
              auVar155._4_2_ = auVar155._0_2_;
              auVar155._6_2_ = auVar155._0_2_;
              auVar155._8_2_ = auVar155._0_2_;
              auVar155._10_2_ = auVar155._0_2_;
              auVar155._12_2_ = auVar155._0_2_;
              auVar155._14_2_ = auVar155._0_2_;
              auVar155._16_2_ = auVar155._0_2_;
              auVar155._18_2_ = auVar155._0_2_;
              auVar155._20_2_ = auVar155._0_2_;
              auVar155._22_2_ = auVar155._0_2_;
              auVar155._24_2_ = auVar155._0_2_;
              auVar155._26_2_ = auVar155._0_2_;
              auVar155._28_2_ = auVar155._0_2_;
              auVar155._30_2_ = auVar155._0_2_;
              if ((int)uVar130 < 1) {
                uVar128 = 0;
              }
              else {
                pauVar124 = (undefined1 (*) [32])((long)piVar123 + lVar127);
                uVar128 = 0;
                do {
                  auVar148 = vpmullw_avx2(auVar155,*(undefined1 (*) [32])(piVar122 + uVar128));
                  lVar121 = 0;
                  pauVar125 = pauVar124;
                  do {
                    auVar165 = vpmaddwd_avx2(auVar148,*pauVar125);
                    auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar121));
                    *(undefined1 (*) [32])(local_240 + lVar121) = auVar165;
                    lVar121 = lVar121 + 0x20;
                    pauVar125 = (undefined1 (*) [32])(*pauVar125 + lVar126);
                  } while (lVar121 != 0xe0);
                  uVar128 = uVar128 + 0x10;
                  pauVar124 = pauVar124 + 1;
                } while ((long)uVar128 < lVar140);
                uVar128 = uVar128 & 0xffffffff;
              }
              if (uVar144 != 0) {
                auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar122 + uVar128));
                auVar148 = vpmullw_avx2(auVar155,auVar148);
                pauVar124 = (undefined1 (*) [32])((long)piVar123 + uVar128 * 2 + lVar127);
                lVar121 = 0;
                do {
                  auVar165 = vpmaddwd_avx2(auVar148,*pauVar124);
                  auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar121));
                  *(undefined1 (*) [32])(local_240 + lVar121) = auVar165;
                  lVar121 = lVar121 + 0x20;
                  pauVar124 = (undefined1 (*) [32])(*pauVar124 + lVar126);
                } while (lVar121 != 0xe0);
              }
              iVar145 = iVar145 + iVar143;
              piVar123 = piVar123 + (int)(iVar143 * uVar139);
              piVar122 = piVar122 + (int)(iVar143 * uVar139);
            } while (iVar145 < v_end);
            auVar34._8_8_ = uStack_1f8;
            auVar34._0_8_ = local_200;
            auVar34._16_8_ = uStack_1f0;
            auVar34._24_8_ = uStack_1e8;
            auVar13._8_8_ = uStack_218;
            auVar13._0_8_ = local_220;
            auVar13._16_8_ = uStack_210;
            auVar13._24_8_ = uStack_208;
            auVar148 = vphaddd_avx2(local_240,auVar13);
            auVar53._8_8_ = uStack_1d8;
            auVar53._0_8_ = local_1e0;
            auVar53._16_8_ = uStack_1d0;
            auVar53._24_8_ = uStack_1c8;
            auVar165 = vphaddd_avx2(auVar34,auVar53);
            auVar148 = vphaddd_avx2(auVar148,auVar165);
            auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
            auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
            auVar148 = vpaddq_avx2(auVar165,auVar148);
            *(undefined1 (*) [32])(H + uVar135 * 0x31 + uVar138 * 7) = auVar148;
            auVar75._8_8_ = uStack_1b8;
            auVar75._0_8_ = local_1c0;
            auVar75._16_8_ = uStack_1b0;
            auVar75._24_8_ = uStack_1a8;
            auVar91._8_8_ = uStack_198;
            auVar91._0_8_ = local_1a0;
            auVar91._16_8_ = uStack_190;
            auVar91._24_8_ = uStack_188;
            auVar148 = vphaddd_avx2(auVar75,auVar91);
            auVar100._8_8_ = uStack_178;
            auVar100._0_8_ = local_180;
            auVar100._16_8_ = uStack_170;
            auVar100._24_8_ = uStack_168;
            auVar165 = vphaddd_avx2(auVar100,auVar100);
            auVar148 = vphaddd_avx2(auVar148,auVar165);
            auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
            auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
            auVar148 = vpaddq_avx2(auVar165,auVar148);
            *(undefined1 (*) [32])(H + uVar135 * 0x31 + uVar138 * 7 + 4) = auVar148;
            lVar127 = lVar127 + 2;
          } while (uVar138 != uVar131 + 1);
        }
        uVar135 = uVar135 + 7;
        uVar142 = uVar142 + 1;
        local_268 = local_268 + 2;
      } while (uVar142 != 7);
      lVar137 = (long)(int)(uVar139 * 3);
      uVar135 = 3;
      local_268 = 2;
      uVar142 = 0;
      do {
        uVar131 = 5;
        if (5 < (uint)uVar142) {
          uVar131 = (uint)uVar142;
        }
        piVar123 = dgd_avg + uVar135 / 7;
        piVar129 = piVar123 + lVar137;
        local_180 = 0;
        uStack_178 = 0;
        uStack_170 = 0;
        uStack_168 = 0;
        local_1a0 = 0;
        uStack_198 = 0;
        uStack_190 = 0;
        uStack_188 = 0;
        local_1c0 = 0;
        uStack_1b8 = 0;
        uStack_1b0 = 0;
        uStack_1a8 = 0;
        local_1e0 = 0;
        uStack_1d8 = 0;
        uStack_1d0 = 0;
        uStack_1c8 = 0;
        local_200 = 0;
        uStack_1f8 = 0;
        uStack_1f0 = 0;
        uStack_1e8 = 0;
        local_220 = 0;
        uStack_218 = 0;
        uStack_210 = 0;
        uStack_208 = 0;
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        piVar122 = piVar129;
        iVar145 = v_start;
        iVar143 = iVar119;
        do {
          iVar134 = v_end - iVar145;
          if (3 < v_end - iVar145) {
            iVar134 = iVar143;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar134 = iVar143;
          }
          iVar143 = iVar134;
          auVar156._0_2_ = (undefined2)iVar143;
          auVar156._2_2_ = auVar156._0_2_;
          auVar156._4_2_ = auVar156._0_2_;
          auVar156._6_2_ = auVar156._0_2_;
          auVar156._8_2_ = auVar156._0_2_;
          auVar156._10_2_ = auVar156._0_2_;
          auVar156._12_2_ = auVar156._0_2_;
          auVar156._14_2_ = auVar156._0_2_;
          auVar156._16_2_ = auVar156._0_2_;
          auVar156._18_2_ = auVar156._0_2_;
          auVar156._20_2_ = auVar156._0_2_;
          auVar156._22_2_ = auVar156._0_2_;
          auVar156._24_2_ = auVar156._0_2_;
          auVar156._26_2_ = auVar156._0_2_;
          auVar156._28_2_ = auVar156._0_2_;
          auVar156._30_2_ = auVar156._0_2_;
          if ((int)uVar130 < 1) {
            uVar138 = 0;
          }
          else {
            pauVar124 = (undefined1 (*) [32])(piVar123 + lVar137);
            uVar138 = 0;
            do {
              auVar148 = vpmullw_avx2(auVar156,*(undefined1 (*) [32])(piVar122 + uVar138));
              lVar127 = 0;
              pauVar125 = pauVar124;
              do {
                auVar165 = vpmaddwd_avx2(auVar148,*pauVar125);
                auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar127));
                *(undefined1 (*) [32])(local_240 + lVar127) = auVar165;
                lVar127 = lVar127 + 0x20;
                pauVar125 = (undefined1 (*) [32])(*pauVar125 + lVar126);
              } while (lVar127 != 0x80);
              uVar138 = uVar138 + 0x10;
              pauVar124 = pauVar124 + 1;
            } while ((long)uVar138 < lVar140);
            uVar138 = uVar138 & 0xffffffff;
          }
          if (uVar144 != 0) {
            auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar122 + uVar138));
            auVar148 = vpmullw_avx2(auVar156,auVar148);
            pauVar124 = (undefined1 (*) [32])(piVar123 + uVar138 + lVar137);
            lVar127 = 0;
            do {
              auVar165 = vpmaddwd_avx2(auVar148,*pauVar124);
              auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar127));
              *(undefined1 (*) [32])(local_240 + lVar127) = auVar165;
              lVar127 = lVar127 + 0x20;
              pauVar124 = (undefined1 (*) [32])(*pauVar124 + lVar126);
            } while (lVar127 != 0x80);
          }
          iVar145 = iVar145 + iVar143;
          piVar123 = piVar123 + (int)(iVar143 * uVar139);
          piVar122 = piVar122 + (int)(iVar143 * uVar139);
        } while (iVar145 < v_end);
        auVar35._8_8_ = uStack_1f8;
        auVar35._0_8_ = local_200;
        auVar35._16_8_ = uStack_1f0;
        auVar35._24_8_ = uStack_1e8;
        auVar14._8_8_ = uStack_218;
        auVar14._0_8_ = local_220;
        auVar14._16_8_ = uStack_210;
        auVar14._24_8_ = uStack_208;
        auVar148 = vphaddd_avx2(local_240,auVar14);
        auVar54._8_8_ = uStack_1d8;
        auVar54._0_8_ = local_1e0;
        auVar54._16_8_ = uStack_1d0;
        auVar54._24_8_ = uStack_1c8;
        auVar165 = vphaddd_avx2(auVar35,auVar54);
        auVar148 = vphaddd_avx2(auVar148,auVar165);
        auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
        auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
        auVar148 = vpaddq_avx2(auVar165,auVar148);
        *(undefined1 (*) [32])(H + uVar135 * 0x32) = auVar148;
        if (uVar135 < 0x2a) {
          lVar127 = local_268;
          uVar138 = uVar142;
          do {
            uVar138 = uVar138 + 1;
            local_180 = 0;
            uStack_178 = 0;
            uStack_170 = 0;
            uStack_168 = 0;
            local_1a0 = 0;
            uStack_198 = 0;
            uStack_190 = 0;
            uStack_188 = 0;
            local_1c0 = 0;
            uStack_1b8 = 0;
            uStack_1b0 = 0;
            uStack_1a8 = 0;
            local_1e0 = 0;
            uStack_1d8 = 0;
            uStack_1d0 = 0;
            uStack_1c8 = 0;
            local_200 = 0;
            uStack_1f8 = 0;
            uStack_1f0 = 0;
            uStack_1e8 = 0;
            local_220 = 0;
            uStack_218 = 0;
            uStack_210 = 0;
            uStack_208 = 0;
            local_240._0_16_ = ZEXT816(0);
            local_240 = ZEXT1632(local_240._0_16_);
            piVar122 = piVar129;
            piVar123 = dgd_avg;
            iVar145 = v_start;
            iVar143 = iVar119;
            do {
              iVar134 = v_end - iVar145;
              if (3 < v_end - iVar145) {
                iVar134 = iVar143;
              }
              if (use_downsampled_wiener_stats == 0) {
                iVar134 = iVar143;
              }
              iVar143 = iVar134;
              auVar157._0_2_ = (undefined2)iVar143;
              auVar157._2_2_ = auVar157._0_2_;
              auVar157._4_2_ = auVar157._0_2_;
              auVar157._6_2_ = auVar157._0_2_;
              auVar157._8_2_ = auVar157._0_2_;
              auVar157._10_2_ = auVar157._0_2_;
              auVar157._12_2_ = auVar157._0_2_;
              auVar157._14_2_ = auVar157._0_2_;
              auVar157._16_2_ = auVar157._0_2_;
              auVar157._18_2_ = auVar157._0_2_;
              auVar157._20_2_ = auVar157._0_2_;
              auVar157._22_2_ = auVar157._0_2_;
              auVar157._24_2_ = auVar157._0_2_;
              auVar157._26_2_ = auVar157._0_2_;
              auVar157._28_2_ = auVar157._0_2_;
              auVar157._30_2_ = auVar157._0_2_;
              if ((int)uVar130 < 1) {
                uVar128 = 0;
              }
              else {
                pauVar124 = (undefined1 (*) [32])((long)piVar123 + lVar127);
                uVar128 = 0;
                do {
                  auVar148 = vpmullw_avx2(auVar157,*(undefined1 (*) [32])(piVar122 + uVar128));
                  lVar121 = 0;
                  pauVar125 = pauVar124;
                  do {
                    auVar165 = vpmaddwd_avx2(auVar148,*pauVar125);
                    auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar121));
                    *(undefined1 (*) [32])(local_240 + lVar121) = auVar165;
                    lVar121 = lVar121 + 0x20;
                    pauVar125 = (undefined1 (*) [32])(*pauVar125 + lVar126);
                  } while (lVar121 != 0xe0);
                  uVar128 = uVar128 + 0x10;
                  pauVar124 = pauVar124 + 1;
                } while ((long)uVar128 < lVar140);
                uVar128 = uVar128 & 0xffffffff;
              }
              if (uVar144 != 0) {
                auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar122 + uVar128));
                auVar148 = vpmullw_avx2(auVar157,auVar148);
                pauVar124 = (undefined1 (*) [32])((long)piVar123 + uVar128 * 2 + lVar127);
                lVar121 = 0;
                do {
                  auVar165 = vpmaddwd_avx2(auVar148,*pauVar124);
                  auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar121));
                  *(undefined1 (*) [32])(local_240 + lVar121) = auVar165;
                  lVar121 = lVar121 + 0x20;
                  pauVar124 = (undefined1 (*) [32])(*pauVar124 + lVar126);
                } while (lVar121 != 0xe0);
              }
              iVar145 = iVar145 + iVar143;
              piVar123 = piVar123 + (int)(iVar143 * uVar139);
              piVar122 = piVar122 + (int)(iVar143 * uVar139);
            } while (iVar145 < v_end);
            auVar36._8_8_ = uStack_1f8;
            auVar36._0_8_ = local_200;
            auVar36._16_8_ = uStack_1f0;
            auVar36._24_8_ = uStack_1e8;
            auVar15._8_8_ = uStack_218;
            auVar15._0_8_ = local_220;
            auVar15._16_8_ = uStack_210;
            auVar15._24_8_ = uStack_208;
            auVar148 = vphaddd_avx2(local_240,auVar15);
            auVar55._8_8_ = uStack_1d8;
            auVar55._0_8_ = local_1e0;
            auVar55._16_8_ = uStack_1d0;
            auVar55._24_8_ = uStack_1c8;
            auVar165 = vphaddd_avx2(auVar36,auVar55);
            auVar148 = vphaddd_avx2(auVar148,auVar165);
            auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
            auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
            auVar148 = vpaddq_avx2(auVar165,auVar148);
            *(undefined1 (*) [32])(H + uVar135 * 0x31 + uVar138 * 7) = auVar148;
            auVar76._8_8_ = uStack_1b8;
            auVar76._0_8_ = local_1c0;
            auVar76._16_8_ = uStack_1b0;
            auVar76._24_8_ = uStack_1a8;
            auVar92._8_8_ = uStack_198;
            auVar92._0_8_ = local_1a0;
            auVar92._16_8_ = uStack_190;
            auVar92._24_8_ = uStack_188;
            auVar148 = vphaddd_avx2(auVar76,auVar92);
            auVar101._8_8_ = uStack_178;
            auVar101._0_8_ = local_180;
            auVar101._16_8_ = uStack_170;
            auVar101._24_8_ = uStack_168;
            auVar165 = vphaddd_avx2(auVar101,auVar101);
            auVar148 = vphaddd_avx2(auVar148,auVar165);
            auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
            auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
            auVar148 = vpaddq_avx2(auVar165,auVar148);
            *(undefined1 (*) [32])(H + uVar135 * 0x31 + uVar138 * 7 + 4) = auVar148;
            lVar127 = lVar127 + 2;
          } while (uVar138 != uVar131 + 1);
        }
        uVar135 = uVar135 + 7;
        uVar142 = uVar142 + 1;
        local_268 = local_268 + 2;
      } while (uVar142 != 7);
      lVar137 = (long)(int)(uVar139 * 4);
      uVar135 = 4;
      local_268 = 2;
      uVar142 = 0;
      do {
        uVar131 = 5;
        if (5 < (uint)uVar142) {
          uVar131 = (uint)uVar142;
        }
        piVar123 = dgd_avg + uVar135 / 7;
        piVar129 = piVar123 + lVar137;
        local_180 = 0;
        uStack_178 = 0;
        uStack_170 = 0;
        uStack_168 = 0;
        local_1a0 = 0;
        uStack_198 = 0;
        uStack_190 = 0;
        uStack_188 = 0;
        local_1c0 = 0;
        uStack_1b8 = 0;
        uStack_1b0 = 0;
        uStack_1a8 = 0;
        local_1e0 = 0;
        uStack_1d8 = 0;
        uStack_1d0 = 0;
        uStack_1c8 = 0;
        local_200 = 0;
        uStack_1f8 = 0;
        uStack_1f0 = 0;
        uStack_1e8 = 0;
        local_220 = 0;
        uStack_218 = 0;
        uStack_210 = 0;
        uStack_208 = 0;
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        piVar122 = piVar129;
        iVar145 = v_start;
        iVar143 = iVar119;
        do {
          iVar134 = v_end - iVar145;
          if (3 < v_end - iVar145) {
            iVar134 = iVar143;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar134 = iVar143;
          }
          iVar143 = iVar134;
          auVar158._0_2_ = (undefined2)iVar143;
          auVar158._2_2_ = auVar158._0_2_;
          auVar158._4_2_ = auVar158._0_2_;
          auVar158._6_2_ = auVar158._0_2_;
          auVar158._8_2_ = auVar158._0_2_;
          auVar158._10_2_ = auVar158._0_2_;
          auVar158._12_2_ = auVar158._0_2_;
          auVar158._14_2_ = auVar158._0_2_;
          auVar158._16_2_ = auVar158._0_2_;
          auVar158._18_2_ = auVar158._0_2_;
          auVar158._20_2_ = auVar158._0_2_;
          auVar158._22_2_ = auVar158._0_2_;
          auVar158._24_2_ = auVar158._0_2_;
          auVar158._26_2_ = auVar158._0_2_;
          auVar158._28_2_ = auVar158._0_2_;
          auVar158._30_2_ = auVar158._0_2_;
          if ((int)uVar130 < 1) {
            uVar138 = 0;
          }
          else {
            pauVar124 = (undefined1 (*) [32])(piVar123 + lVar137);
            uVar138 = 0;
            do {
              auVar148 = vpmullw_avx2(auVar158,*(undefined1 (*) [32])(piVar122 + uVar138));
              lVar127 = 0;
              pauVar125 = pauVar124;
              do {
                auVar165 = vpmaddwd_avx2(auVar148,*pauVar125);
                auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar127));
                *(undefined1 (*) [32])(local_240 + lVar127) = auVar165;
                lVar127 = lVar127 + 0x20;
                pauVar125 = (undefined1 (*) [32])(*pauVar125 + lVar126);
              } while (lVar127 != 0x60);
              uVar138 = uVar138 + 0x10;
              pauVar124 = pauVar124 + 1;
            } while ((long)uVar138 < lVar140);
            uVar138 = uVar138 & 0xffffffff;
          }
          if (uVar144 != 0) {
            auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar122 + uVar138));
            auVar148 = vpmullw_avx2(auVar158,auVar148);
            pauVar124 = (undefined1 (*) [32])(piVar123 + uVar138 + lVar137);
            lVar127 = 0;
            do {
              auVar165 = vpmaddwd_avx2(auVar148,*pauVar124);
              auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar127));
              *(undefined1 (*) [32])(local_240 + lVar127) = auVar165;
              lVar127 = lVar127 + 0x20;
              pauVar124 = (undefined1 (*) [32])(*pauVar124 + lVar126);
            } while (lVar127 != 0x60);
          }
          iVar145 = iVar145 + iVar143;
          piVar123 = piVar123 + (int)(iVar143 * uVar139);
          piVar122 = piVar122 + (int)(iVar143 * uVar139);
        } while (iVar145 < v_end);
        auVar37._8_8_ = uStack_1f8;
        auVar37._0_8_ = local_200;
        auVar37._16_8_ = uStack_1f0;
        auVar37._24_8_ = uStack_1e8;
        auVar16._8_8_ = uStack_218;
        auVar16._0_8_ = local_220;
        auVar16._16_8_ = uStack_210;
        auVar16._24_8_ = uStack_208;
        auVar148 = vphaddd_avx2(local_240,auVar16);
        auVar165 = vphaddd_avx2(auVar37,ZEXT1632(ZEXT816(0)));
        auVar148 = vphaddd_avx2(auVar148,auVar165);
        auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
        auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
        auVar148 = vpaddq_avx2(auVar165,auVar148);
        *(undefined1 (*) [32])(H + uVar135 * 0x32) = auVar148;
        if (uVar135 < 0x2a) {
          lVar127 = local_268;
          uVar138 = uVar142;
          do {
            uVar138 = uVar138 + 1;
            local_180 = 0;
            uStack_178 = 0;
            uStack_170 = 0;
            uStack_168 = 0;
            local_1a0 = 0;
            uStack_198 = 0;
            uStack_190 = 0;
            uStack_188 = 0;
            local_1c0 = 0;
            uStack_1b8 = 0;
            uStack_1b0 = 0;
            uStack_1a8 = 0;
            local_1e0 = 0;
            uStack_1d8 = 0;
            uStack_1d0 = 0;
            uStack_1c8 = 0;
            local_200 = 0;
            uStack_1f8 = 0;
            uStack_1f0 = 0;
            uStack_1e8 = 0;
            local_220 = 0;
            uStack_218 = 0;
            uStack_210 = 0;
            uStack_208 = 0;
            local_240._0_16_ = ZEXT816(0);
            local_240 = ZEXT1632(local_240._0_16_);
            piVar122 = piVar129;
            piVar123 = dgd_avg;
            iVar145 = v_start;
            iVar143 = iVar119;
            do {
              iVar134 = v_end - iVar145;
              if (3 < v_end - iVar145) {
                iVar134 = iVar143;
              }
              if (use_downsampled_wiener_stats == 0) {
                iVar134 = iVar143;
              }
              iVar143 = iVar134;
              auVar159._0_2_ = (undefined2)iVar143;
              auVar159._2_2_ = auVar159._0_2_;
              auVar159._4_2_ = auVar159._0_2_;
              auVar159._6_2_ = auVar159._0_2_;
              auVar159._8_2_ = auVar159._0_2_;
              auVar159._10_2_ = auVar159._0_2_;
              auVar159._12_2_ = auVar159._0_2_;
              auVar159._14_2_ = auVar159._0_2_;
              auVar159._16_2_ = auVar159._0_2_;
              auVar159._18_2_ = auVar159._0_2_;
              auVar159._20_2_ = auVar159._0_2_;
              auVar159._22_2_ = auVar159._0_2_;
              auVar159._24_2_ = auVar159._0_2_;
              auVar159._26_2_ = auVar159._0_2_;
              auVar159._28_2_ = auVar159._0_2_;
              auVar159._30_2_ = auVar159._0_2_;
              if ((int)uVar130 < 1) {
                uVar128 = 0;
              }
              else {
                pauVar124 = (undefined1 (*) [32])((long)piVar123 + lVar127);
                uVar128 = 0;
                do {
                  auVar148 = vpmullw_avx2(auVar159,*(undefined1 (*) [32])(piVar122 + uVar128));
                  lVar121 = 0;
                  pauVar125 = pauVar124;
                  do {
                    auVar165 = vpmaddwd_avx2(auVar148,*pauVar125);
                    auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar121));
                    *(undefined1 (*) [32])(local_240 + lVar121) = auVar165;
                    lVar121 = lVar121 + 0x20;
                    pauVar125 = (undefined1 (*) [32])(*pauVar125 + lVar126);
                  } while (lVar121 != 0xe0);
                  uVar128 = uVar128 + 0x10;
                  pauVar124 = pauVar124 + 1;
                } while ((long)uVar128 < lVar140);
                uVar128 = uVar128 & 0xffffffff;
              }
              if (uVar144 != 0) {
                auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar122 + uVar128));
                auVar148 = vpmullw_avx2(auVar159,auVar148);
                pauVar124 = (undefined1 (*) [32])((long)piVar123 + uVar128 * 2 + lVar127);
                lVar121 = 0;
                do {
                  auVar165 = vpmaddwd_avx2(auVar148,*pauVar124);
                  auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar121));
                  *(undefined1 (*) [32])(local_240 + lVar121) = auVar165;
                  lVar121 = lVar121 + 0x20;
                  pauVar124 = (undefined1 (*) [32])(*pauVar124 + lVar126);
                } while (lVar121 != 0xe0);
              }
              iVar145 = iVar145 + iVar143;
              piVar123 = piVar123 + (int)(iVar143 * uVar139);
              piVar122 = piVar122 + (int)(iVar143 * uVar139);
            } while (iVar145 < v_end);
            auVar38._8_8_ = uStack_1f8;
            auVar38._0_8_ = local_200;
            auVar38._16_8_ = uStack_1f0;
            auVar38._24_8_ = uStack_1e8;
            auVar17._8_8_ = uStack_218;
            auVar17._0_8_ = local_220;
            auVar17._16_8_ = uStack_210;
            auVar17._24_8_ = uStack_208;
            auVar148 = vphaddd_avx2(local_240,auVar17);
            auVar56._8_8_ = uStack_1d8;
            auVar56._0_8_ = local_1e0;
            auVar56._16_8_ = uStack_1d0;
            auVar56._24_8_ = uStack_1c8;
            auVar165 = vphaddd_avx2(auVar38,auVar56);
            auVar148 = vphaddd_avx2(auVar148,auVar165);
            auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
            auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
            auVar148 = vpaddq_avx2(auVar165,auVar148);
            *(undefined1 (*) [32])(H + uVar135 * 0x31 + uVar138 * 7) = auVar148;
            auVar77._8_8_ = uStack_1b8;
            auVar77._0_8_ = local_1c0;
            auVar77._16_8_ = uStack_1b0;
            auVar77._24_8_ = uStack_1a8;
            auVar93._8_8_ = uStack_198;
            auVar93._0_8_ = local_1a0;
            auVar93._16_8_ = uStack_190;
            auVar93._24_8_ = uStack_188;
            auVar148 = vphaddd_avx2(auVar77,auVar93);
            auVar102._8_8_ = uStack_178;
            auVar102._0_8_ = local_180;
            auVar102._16_8_ = uStack_170;
            auVar102._24_8_ = uStack_168;
            auVar165 = vphaddd_avx2(auVar102,auVar102);
            auVar148 = vphaddd_avx2(auVar148,auVar165);
            auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
            auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
            auVar148 = vpaddq_avx2(auVar165,auVar148);
            *(undefined1 (*) [32])(H + uVar135 * 0x31 + uVar138 * 7 + 4) = auVar148;
            lVar127 = lVar127 + 2;
          } while (uVar138 != uVar131 + 1);
        }
        uVar135 = uVar135 + 7;
        uVar142 = uVar142 + 1;
        local_268 = local_268 + 2;
      } while (uVar142 != 7);
      lVar137 = (long)(int)(uVar139 * 5);
      uVar135 = 5;
      local_268 = 2;
      uVar142 = 0;
      do {
        uVar131 = 5;
        if (5 < (uint)uVar142) {
          uVar131 = (uint)uVar142;
        }
        piVar123 = dgd_avg + uVar135 / 7;
        piVar129 = piVar123 + lVar137;
        local_180 = 0;
        uStack_178 = 0;
        uStack_170 = 0;
        uStack_168 = 0;
        local_1a0 = 0;
        uStack_198 = 0;
        uStack_190 = 0;
        uStack_188 = 0;
        local_1c0 = 0;
        uStack_1b8 = 0;
        uStack_1b0 = 0;
        uStack_1a8 = 0;
        local_1e0 = 0;
        uStack_1d8 = 0;
        uStack_1d0 = 0;
        uStack_1c8 = 0;
        local_200 = 0;
        uStack_1f8 = 0;
        uStack_1f0 = 0;
        uStack_1e8 = 0;
        local_220 = 0;
        uStack_218 = 0;
        uStack_210 = 0;
        uStack_208 = 0;
        local_240._0_16_ = ZEXT816(0);
        local_240 = ZEXT1632(local_240._0_16_);
        piVar122 = piVar129;
        iVar145 = v_start;
        iVar143 = iVar119;
        do {
          iVar134 = v_end - iVar145;
          if (3 < v_end - iVar145) {
            iVar134 = iVar143;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar134 = iVar143;
          }
          iVar143 = iVar134;
          auVar160._0_2_ = (undefined2)iVar143;
          auVar160._2_2_ = auVar160._0_2_;
          auVar160._4_2_ = auVar160._0_2_;
          auVar160._6_2_ = auVar160._0_2_;
          auVar160._8_2_ = auVar160._0_2_;
          auVar160._10_2_ = auVar160._0_2_;
          auVar160._12_2_ = auVar160._0_2_;
          auVar160._14_2_ = auVar160._0_2_;
          auVar160._16_2_ = auVar160._0_2_;
          auVar160._18_2_ = auVar160._0_2_;
          auVar160._20_2_ = auVar160._0_2_;
          auVar160._22_2_ = auVar160._0_2_;
          auVar160._24_2_ = auVar160._0_2_;
          auVar160._26_2_ = auVar160._0_2_;
          auVar160._28_2_ = auVar160._0_2_;
          auVar160._30_2_ = auVar160._0_2_;
          if ((int)uVar130 < 1) {
            uVar138 = 0;
          }
          else {
            pauVar124 = (undefined1 (*) [32])(piVar123 + lVar137);
            uVar138 = 0;
            do {
              auVar148 = vpmullw_avx2(auVar160,*(undefined1 (*) [32])(piVar122 + uVar138));
              lVar127 = 0;
              pauVar125 = pauVar124;
              do {
                auVar165 = vpmaddwd_avx2(auVar148,*pauVar125);
                auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar127));
                *(undefined1 (*) [32])(local_240 + lVar127) = auVar165;
                lVar127 = lVar127 + 0x20;
                pauVar125 = (undefined1 (*) [32])(*pauVar125 + lVar126);
              } while (lVar127 == 0x20);
              uVar138 = uVar138 + 0x10;
              pauVar124 = pauVar124 + 1;
            } while ((long)uVar138 < lVar140);
            uVar138 = uVar138 & 0xffffffff;
          }
          if (uVar144 != 0) {
            auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar122 + uVar138));
            auVar148 = vpmullw_avx2(auVar160,auVar148);
            pauVar124 = (undefined1 (*) [32])(piVar123 + uVar138 + lVar137);
            lVar127 = 0;
            do {
              auVar165 = vpmaddwd_avx2(auVar148,*pauVar124);
              auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar127));
              *(undefined1 (*) [32])(local_240 + lVar127) = auVar165;
              lVar127 = lVar127 + 0x20;
              pauVar124 = (undefined1 (*) [32])(*pauVar124 + lVar126);
            } while (lVar127 == 0x20);
          }
          iVar145 = iVar145 + iVar143;
          piVar123 = piVar123 + (int)(iVar143 * uVar139);
          piVar122 = piVar122 + (int)(iVar143 * uVar139);
        } while (iVar145 < v_end);
        auVar18._8_8_ = uStack_218;
        auVar18._0_8_ = local_220;
        auVar18._16_8_ = uStack_210;
        auVar18._24_8_ = uStack_208;
        auVar148 = vphaddd_avx2(local_240,auVar18);
        auVar165 = vphaddd_avx2(ZEXT1632(ZEXT816(0)),ZEXT1632(ZEXT816(0)));
        auVar148 = vphaddd_avx2(auVar148,auVar165);
        auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
        auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
        auVar148 = vpaddq_avx2(auVar165,auVar148);
        *(undefined1 (*) [32])(H + uVar135 * 0x32) = auVar148;
        if (uVar135 < 0x2a) {
          lVar127 = local_268;
          uVar138 = uVar142;
          do {
            uVar138 = uVar138 + 1;
            local_180 = 0;
            uStack_178 = 0;
            uStack_170 = 0;
            uStack_168 = 0;
            local_1a0 = 0;
            uStack_198 = 0;
            uStack_190 = 0;
            uStack_188 = 0;
            local_1c0 = 0;
            uStack_1b8 = 0;
            uStack_1b0 = 0;
            uStack_1a8 = 0;
            local_1e0 = 0;
            uStack_1d8 = 0;
            uStack_1d0 = 0;
            uStack_1c8 = 0;
            local_200 = 0;
            uStack_1f8 = 0;
            uStack_1f0 = 0;
            uStack_1e8 = 0;
            local_220 = 0;
            uStack_218 = 0;
            uStack_210 = 0;
            uStack_208 = 0;
            local_240._0_16_ = ZEXT816(0);
            local_240 = ZEXT1632(local_240._0_16_);
            piVar122 = piVar129;
            piVar123 = dgd_avg;
            iVar145 = v_start;
            iVar143 = iVar119;
            do {
              iVar134 = v_end - iVar145;
              if (3 < v_end - iVar145) {
                iVar134 = iVar143;
              }
              if (use_downsampled_wiener_stats == 0) {
                iVar134 = iVar143;
              }
              iVar143 = iVar134;
              auVar161._0_2_ = (undefined2)iVar143;
              auVar161._2_2_ = auVar161._0_2_;
              auVar161._4_2_ = auVar161._0_2_;
              auVar161._6_2_ = auVar161._0_2_;
              auVar161._8_2_ = auVar161._0_2_;
              auVar161._10_2_ = auVar161._0_2_;
              auVar161._12_2_ = auVar161._0_2_;
              auVar161._14_2_ = auVar161._0_2_;
              auVar161._16_2_ = auVar161._0_2_;
              auVar161._18_2_ = auVar161._0_2_;
              auVar161._20_2_ = auVar161._0_2_;
              auVar161._22_2_ = auVar161._0_2_;
              auVar161._24_2_ = auVar161._0_2_;
              auVar161._26_2_ = auVar161._0_2_;
              auVar161._28_2_ = auVar161._0_2_;
              auVar161._30_2_ = auVar161._0_2_;
              if ((int)uVar130 < 1) {
                uVar128 = 0;
              }
              else {
                pauVar124 = (undefined1 (*) [32])((long)piVar123 + lVar127);
                uVar128 = 0;
                do {
                  auVar148 = vpmullw_avx2(auVar161,*(undefined1 (*) [32])(piVar122 + uVar128));
                  lVar121 = 0;
                  pauVar125 = pauVar124;
                  do {
                    auVar165 = vpmaddwd_avx2(auVar148,*pauVar125);
                    auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar121));
                    *(undefined1 (*) [32])(local_240 + lVar121) = auVar165;
                    lVar121 = lVar121 + 0x20;
                    pauVar125 = (undefined1 (*) [32])(*pauVar125 + lVar126);
                  } while (lVar121 != 0xe0);
                  uVar128 = uVar128 + 0x10;
                  pauVar124 = pauVar124 + 1;
                } while ((long)uVar128 < lVar140);
                uVar128 = uVar128 & 0xffffffff;
              }
              if (uVar144 != 0) {
                auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar122 + uVar128));
                auVar148 = vpmullw_avx2(auVar161,auVar148);
                pauVar124 = (undefined1 (*) [32])((long)piVar123 + uVar128 * 2 + lVar127);
                lVar121 = 0;
                do {
                  auVar165 = vpmaddwd_avx2(auVar148,*pauVar124);
                  auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar121));
                  *(undefined1 (*) [32])(local_240 + lVar121) = auVar165;
                  lVar121 = lVar121 + 0x20;
                  pauVar124 = (undefined1 (*) [32])(*pauVar124 + lVar126);
                } while (lVar121 != 0xe0);
              }
              iVar145 = iVar145 + iVar143;
              piVar123 = piVar123 + (int)(iVar143 * uVar139);
              piVar122 = piVar122 + (int)(iVar143 * uVar139);
            } while (iVar145 < v_end);
            auVar39._8_8_ = uStack_1f8;
            auVar39._0_8_ = local_200;
            auVar39._16_8_ = uStack_1f0;
            auVar39._24_8_ = uStack_1e8;
            auVar19._8_8_ = uStack_218;
            auVar19._0_8_ = local_220;
            auVar19._16_8_ = uStack_210;
            auVar19._24_8_ = uStack_208;
            auVar148 = vphaddd_avx2(local_240,auVar19);
            auVar57._8_8_ = uStack_1d8;
            auVar57._0_8_ = local_1e0;
            auVar57._16_8_ = uStack_1d0;
            auVar57._24_8_ = uStack_1c8;
            auVar165 = vphaddd_avx2(auVar39,auVar57);
            auVar148 = vphaddd_avx2(auVar148,auVar165);
            auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
            auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
            auVar148 = vpaddq_avx2(auVar165,auVar148);
            *(undefined1 (*) [32])(H + uVar135 * 0x31 + uVar138 * 7) = auVar148;
            auVar78._8_8_ = uStack_1b8;
            auVar78._0_8_ = local_1c0;
            auVar78._16_8_ = uStack_1b0;
            auVar78._24_8_ = uStack_1a8;
            auVar94._8_8_ = uStack_198;
            auVar94._0_8_ = local_1a0;
            auVar94._16_8_ = uStack_190;
            auVar94._24_8_ = uStack_188;
            auVar148 = vphaddd_avx2(auVar78,auVar94);
            auVar103._8_8_ = uStack_178;
            auVar103._0_8_ = local_180;
            auVar103._16_8_ = uStack_170;
            auVar103._24_8_ = uStack_168;
            auVar165 = vphaddd_avx2(auVar103,auVar103);
            auVar148 = vphaddd_avx2(auVar148,auVar165);
            auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
            auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
            auVar148 = vpaddq_avx2(auVar165,auVar148);
            *(undefined1 (*) [32])(H + uVar135 * 0x31 + uVar138 * 7 + 4) = auVar148;
            lVar127 = lVar127 + 2;
          } while (uVar138 != uVar131 + 1);
        }
        uVar135 = uVar135 + 7;
        uVar142 = uVar142 + 1;
        local_268 = local_268 + 2;
      } while (uVar142 != 7);
      lVar137 = (long)(int)(uVar139 * 6);
      uVar135 = 6;
      local_278 = 2;
      uVar142 = 0;
      do {
        uVar131 = 5;
        if (5 < (uint)uVar142) {
          uVar131 = (uint)uVar142;
        }
        piVar123 = dgd_avg + uVar135 / 7;
        piVar129 = piVar123 + lVar137;
        auVar150 = ZEXT1664((undefined1  [16])0x0);
        piVar122 = piVar129;
        iVar145 = v_start;
        iVar143 = iVar119;
        do {
          iVar134 = v_end - iVar145;
          if (3 < v_end - iVar145) {
            iVar134 = iVar143;
          }
          if (use_downsampled_wiener_stats == 0) {
            iVar134 = iVar143;
          }
          iVar143 = iVar134;
          auVar175._0_2_ = (undefined2)iVar143;
          auVar175._2_2_ = auVar175._0_2_;
          auVar175._4_2_ = auVar175._0_2_;
          auVar175._6_2_ = auVar175._0_2_;
          auVar175._8_2_ = auVar175._0_2_;
          auVar175._10_2_ = auVar175._0_2_;
          auVar175._12_2_ = auVar175._0_2_;
          auVar175._14_2_ = auVar175._0_2_;
          auVar175._16_2_ = auVar175._0_2_;
          auVar175._18_2_ = auVar175._0_2_;
          auVar175._20_2_ = auVar175._0_2_;
          auVar175._22_2_ = auVar175._0_2_;
          auVar175._24_2_ = auVar175._0_2_;
          auVar175._26_2_ = auVar175._0_2_;
          auVar175._28_2_ = auVar175._0_2_;
          auVar175._30_2_ = auVar175._0_2_;
          if ((int)uVar130 < 1) {
            lVar127 = 0;
          }
          else {
            lVar127 = 0;
            do {
              auVar148 = vpmullw_avx2(auVar175,*(undefined1 (*) [32])(piVar122 + lVar127));
              auVar148 = vpmaddwd_avx2(auVar148,*(undefined1 (*) [32])(piVar123 + lVar137 + lVar127)
                                      );
              auVar148 = vpaddd_avx2(auVar148,auVar150._0_32_);
              auVar150 = ZEXT3264(auVar148);
              lVar127 = lVar127 + 0x10;
            } while (lVar127 < lVar140);
          }
          if (uVar144 != 0) {
            auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar122 + lVar127));
            auVar148 = vpmullw_avx2(auVar175,auVar148);
            auVar148 = vpmaddwd_avx2(auVar148,*(undefined1 (*) [32])(piVar123 + lVar127 + lVar137));
            auVar148 = vpaddd_avx2(auVar148,auVar150._0_32_);
            auVar150 = ZEXT3264(auVar148);
          }
          iVar145 = iVar145 + iVar143;
          piVar123 = piVar123 + (int)(iVar143 * uVar139);
          piVar122 = piVar122 + (int)(iVar143 * uVar139);
        } while (iVar145 < v_end);
        auVar148 = vphaddd_avx2(auVar150._0_32_,ZEXT1632(ZEXT816(0)));
        auVar165 = vphaddd_avx2(ZEXT1632(ZEXT816(0)),ZEXT1632(ZEXT816(0)));
        auVar148 = vphaddd_avx2(auVar148,auVar165);
        auVar149 = vpmovsxdq_avx(auVar148._16_16_);
        auVar4 = vpmovsxdq_avx(auVar148._0_16_);
        auVar149 = vpaddq_avx(auVar4,auVar149);
        H[uVar135 * 0x32] = auVar149._0_8_;
        if (uVar135 < 0x2a) {
          lVar127 = local_278;
          uVar138 = uVar142;
          do {
            uVar138 = uVar138 + 1;
            local_180 = 0;
            uStack_178 = 0;
            uStack_170 = 0;
            uStack_168 = 0;
            local_1a0 = 0;
            uStack_198 = 0;
            uStack_190 = 0;
            uStack_188 = 0;
            local_1c0 = 0;
            uStack_1b8 = 0;
            uStack_1b0 = 0;
            uStack_1a8 = 0;
            local_1e0 = 0;
            uStack_1d8 = 0;
            uStack_1d0 = 0;
            uStack_1c8 = 0;
            local_200 = 0;
            uStack_1f8 = 0;
            uStack_1f0 = 0;
            uStack_1e8 = 0;
            local_220 = 0;
            uStack_218 = 0;
            uStack_210 = 0;
            uStack_208 = 0;
            local_240._0_16_ = ZEXT816(0);
            local_240 = ZEXT1632(local_240._0_16_);
            piVar122 = piVar129;
            piVar123 = dgd_avg;
            iVar145 = v_start;
            iVar143 = iVar119;
            do {
              iVar134 = v_end - iVar145;
              if (3 < v_end - iVar145) {
                iVar134 = iVar143;
              }
              if (use_downsampled_wiener_stats == 0) {
                iVar134 = iVar143;
              }
              iVar143 = iVar134;
              auVar162._0_2_ = (undefined2)iVar143;
              auVar162._2_2_ = auVar162._0_2_;
              auVar162._4_2_ = auVar162._0_2_;
              auVar162._6_2_ = auVar162._0_2_;
              auVar162._8_2_ = auVar162._0_2_;
              auVar162._10_2_ = auVar162._0_2_;
              auVar162._12_2_ = auVar162._0_2_;
              auVar162._14_2_ = auVar162._0_2_;
              auVar162._16_2_ = auVar162._0_2_;
              auVar162._18_2_ = auVar162._0_2_;
              auVar162._20_2_ = auVar162._0_2_;
              auVar162._22_2_ = auVar162._0_2_;
              auVar162._24_2_ = auVar162._0_2_;
              auVar162._26_2_ = auVar162._0_2_;
              auVar162._28_2_ = auVar162._0_2_;
              auVar162._30_2_ = auVar162._0_2_;
              if ((int)uVar130 < 1) {
                uVar128 = 0;
              }
              else {
                pauVar124 = (undefined1 (*) [32])((long)piVar123 + lVar127);
                uVar128 = 0;
                do {
                  auVar148 = vpmullw_avx2(auVar162,*(undefined1 (*) [32])(piVar122 + uVar128));
                  lVar121 = 0;
                  pauVar125 = pauVar124;
                  do {
                    auVar165 = vpmaddwd_avx2(auVar148,*pauVar125);
                    auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar121));
                    *(undefined1 (*) [32])(local_240 + lVar121) = auVar165;
                    lVar121 = lVar121 + 0x20;
                    pauVar125 = (undefined1 (*) [32])(*pauVar125 + lVar126);
                  } while (lVar121 != 0xe0);
                  uVar128 = uVar128 + 0x10;
                  pauVar124 = pauVar124 + 1;
                } while ((long)uVar128 < lVar140);
                uVar128 = uVar128 & 0xffffffff;
              }
              if (uVar144 != 0) {
                auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar122 + uVar128));
                auVar148 = vpmullw_avx2(auVar162,auVar148);
                pauVar124 = (undefined1 (*) [32])((long)piVar123 + uVar128 * 2 + lVar127);
                lVar121 = 0;
                do {
                  auVar165 = vpmaddwd_avx2(auVar148,*pauVar124);
                  auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar121));
                  *(undefined1 (*) [32])(local_240 + lVar121) = auVar165;
                  lVar121 = lVar121 + 0x20;
                  pauVar124 = (undefined1 (*) [32])(*pauVar124 + lVar126);
                } while (lVar121 != 0xe0);
              }
              iVar145 = iVar145 + iVar143;
              piVar123 = piVar123 + (int)(iVar143 * uVar139);
              piVar122 = piVar122 + (int)(iVar143 * uVar139);
            } while (iVar145 < v_end);
            auVar40._8_8_ = uStack_1f8;
            auVar40._0_8_ = local_200;
            auVar40._16_8_ = uStack_1f0;
            auVar40._24_8_ = uStack_1e8;
            auVar20._8_8_ = uStack_218;
            auVar20._0_8_ = local_220;
            auVar20._16_8_ = uStack_210;
            auVar20._24_8_ = uStack_208;
            auVar148 = vphaddd_avx2(local_240,auVar20);
            auVar58._8_8_ = uStack_1d8;
            auVar58._0_8_ = local_1e0;
            auVar58._16_8_ = uStack_1d0;
            auVar58._24_8_ = uStack_1c8;
            auVar165 = vphaddd_avx2(auVar40,auVar58);
            auVar148 = vphaddd_avx2(auVar148,auVar165);
            auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
            auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
            auVar148 = vpaddq_avx2(auVar165,auVar148);
            *(undefined1 (*) [32])(H + uVar135 * 0x31 + uVar138 * 7) = auVar148;
            auVar79._8_8_ = uStack_1b8;
            auVar79._0_8_ = local_1c0;
            auVar79._16_8_ = uStack_1b0;
            auVar79._24_8_ = uStack_1a8;
            auVar95._8_8_ = uStack_198;
            auVar95._0_8_ = local_1a0;
            auVar95._16_8_ = uStack_190;
            auVar95._24_8_ = uStack_188;
            auVar148 = vphaddd_avx2(auVar79,auVar95);
            auVar104._8_8_ = uStack_178;
            auVar104._0_8_ = local_180;
            auVar104._16_8_ = uStack_170;
            auVar104._24_8_ = uStack_168;
            auVar165 = vphaddd_avx2(auVar104,auVar104);
            auVar148 = vphaddd_avx2(auVar148,auVar165);
            auVar165 = vpmovsxdq_avx2(auVar148._0_16_);
            auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
            auVar148 = vpaddq_avx2(auVar165,auVar148);
            *(undefined1 (*) [32])(H + uVar135 * 0x31 + uVar138 * 7 + 4) = auVar148;
            lVar127 = lVar127 + 2;
          } while (uVar138 != uVar131 + 1);
        }
        uVar135 = uVar135 + 7;
        uVar142 = uVar142 + 1;
        local_278 = local_278 + 2;
      } while (uVar142 != 7);
      lVar137 = 1;
      local_290 = 6;
      uVar142 = 7;
      do {
        lVar136 = 0;
        lVar121 = 0;
        lVar127 = lVar137;
        do {
          local_180 = 0;
          uStack_178 = 0;
          uStack_170 = 0;
          uStack_168 = 0;
          local_1a0 = 0;
          uStack_198 = 0;
          uStack_190 = 0;
          uStack_188 = 0;
          local_1c0 = 0;
          uStack_1b8 = 0;
          uStack_1b0 = 0;
          uStack_1a8 = 0;
          local_1e0 = 0;
          uStack_1d8 = 0;
          uStack_1d0 = 0;
          uStack_1c8 = 0;
          local_200 = 0;
          uStack_1f8 = 0;
          uStack_1f0 = 0;
          uStack_1e8 = 0;
          local_220 = 0;
          uStack_218 = 0;
          uStack_210 = 0;
          uStack_208 = 0;
          local_240._0_16_ = ZEXT816(0);
          local_240 = ZEXT1632(local_240._0_16_);
          piVar123 = dgd_avg + uVar142 / 7;
          piVar129 = dgd_avg + uVar142 / 7;
          iVar145 = v_start;
          iVar143 = iVar119;
          do {
            iVar134 = v_end - iVar145;
            if (3 < v_end - iVar145) {
              iVar134 = iVar143;
            }
            if (use_downsampled_wiener_stats == 0) {
              iVar134 = iVar143;
            }
            iVar143 = iVar134;
            auVar163._0_2_ = (undefined2)iVar143;
            auVar163._2_2_ = auVar163._0_2_;
            auVar163._4_2_ = auVar163._0_2_;
            auVar163._6_2_ = auVar163._0_2_;
            auVar163._8_2_ = auVar163._0_2_;
            auVar163._10_2_ = auVar163._0_2_;
            auVar163._12_2_ = auVar163._0_2_;
            auVar163._14_2_ = auVar163._0_2_;
            auVar163._16_2_ = auVar163._0_2_;
            auVar163._18_2_ = auVar163._0_2_;
            auVar163._20_2_ = auVar163._0_2_;
            auVar163._22_2_ = auVar163._0_2_;
            auVar163._24_2_ = auVar163._0_2_;
            auVar163._26_2_ = auVar163._0_2_;
            auVar163._28_2_ = auVar163._0_2_;
            auVar163._30_2_ = auVar163._0_2_;
            if ((int)uVar130 < 1) {
              uVar135 = 0;
            }
            else {
              pauVar124 = (undefined1 (*) [32])((long)piVar123 + lVar136);
              uVar135 = 0;
              do {
                auVar148 = vpmullw_avx2(auVar163,*(undefined1 (*) [32])(piVar129 + uVar135));
                lVar132 = 0;
                pauVar125 = pauVar124;
                do {
                  auVar165 = vpmaddwd_avx2(auVar148,*pauVar125);
                  auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar132));
                  *(undefined1 (*) [32])(local_240 + lVar132) = auVar165;
                  lVar132 = lVar132 + 0x20;
                  pauVar125 = (undefined1 (*) [32])(*pauVar125 + lVar126);
                } while (lVar132 != 0xe0);
                uVar135 = uVar135 + 0x10;
                pauVar124 = pauVar124 + 1;
              } while ((long)uVar135 < lVar140);
              uVar135 = uVar135 & 0xffffffff;
            }
            if (uVar144 != 0) {
              auVar148 = vpand_avx2(auVar147,*(undefined1 (*) [32])(piVar129 + uVar135));
              auVar148 = vpmullw_avx2(auVar163,auVar148);
              pauVar124 = (undefined1 (*) [32])((long)piVar123 + uVar135 * 2 + lVar136);
              lVar132 = 0;
              do {
                auVar165 = vpmaddwd_avx2(auVar148,*pauVar124);
                auVar165 = vpaddd_avx2(auVar165,*(undefined1 (*) [32])(local_240 + lVar132));
                *(undefined1 (*) [32])(local_240 + lVar132) = auVar165;
                lVar132 = lVar132 + 0x20;
                pauVar124 = (undefined1 (*) [32])(*pauVar124 + lVar126);
              } while (lVar132 != 0xe0);
            }
            iVar145 = iVar145 + iVar143;
            piVar123 = piVar123 + (int)(iVar143 * uVar139);
            piVar129 = piVar129 + (int)(iVar143 * uVar139);
          } while (iVar145 < v_end);
          auVar41._8_8_ = uStack_1f8;
          auVar41._0_8_ = local_200;
          auVar41._16_8_ = uStack_1f0;
          auVar41._24_8_ = uStack_1e8;
          auVar21._8_8_ = uStack_218;
          auVar21._0_8_ = local_220;
          auVar21._16_8_ = uStack_210;
          auVar21._24_8_ = uStack_208;
          auVar148 = vphaddd_avx2(local_240,auVar21);
          auVar59._8_8_ = uStack_1d8;
          auVar59._0_8_ = local_1e0;
          auVar59._16_8_ = uStack_1d0;
          auVar59._24_8_ = uStack_1c8;
          auVar165 = vphaddd_avx2(auVar41,auVar59);
          auVar80._8_8_ = uStack_1b8;
          auVar80._0_8_ = local_1c0;
          auVar80._16_8_ = uStack_1b0;
          auVar80._24_8_ = uStack_1a8;
          auVar148 = vphaddd_avx2(auVar148,auVar165);
          auVar105._8_8_ = uStack_178;
          auVar105._0_8_ = local_180;
          auVar105._16_8_ = uStack_170;
          auVar105._24_8_ = uStack_168;
          auVar1 = vpmovsxdq_avx2(auVar148._0_16_);
          auVar148 = vpmovsxdq_avx2(auVar148._16_16_);
          auVar96._8_8_ = uStack_198;
          auVar96._0_8_ = local_1a0;
          auVar96._16_8_ = uStack_190;
          auVar96._24_8_ = uStack_188;
          auVar165 = vphaddd_avx2(auVar80,auVar96);
          auVar148 = vpaddq_avx2(auVar1,auVar148);
          auVar1 = vphaddd_avx2(auVar105,auVar105);
          auVar165 = vphaddd_avx2(auVar165,auVar1);
          auVar1 = vpmovsxdq_avx2(auVar165._0_16_);
          auVar165 = vpmovsxdq_avx2(auVar165._16_16_);
          auVar165 = vpaddq_avx2(auVar1,auVar165);
          *(undefined1 (*) [32])(H + uVar142 * 0x31 + lVar127 * 7) = auVar148;
          *(undefined1 (*) [16])(H + uVar142 * 0x31 + lVar127 * 7 + 4) = auVar165._0_16_;
          H[uVar142 * 0x31 + lVar127 * 7 + 6] = auVar165._16_8_;
          lVar121 = lVar121 + 1;
          lVar127 = lVar127 + 1;
          lVar136 = lVar136 + 2;
        } while (lVar121 != local_290);
        uVar142 = uVar142 + 7;
        lVar137 = lVar137 + 1;
        local_290 = local_290 + -1;
      } while (lVar137 != 7);
      pauVar124 = (undefined1 (*) [32])(H + 0xf5);
      pauVar125 = (undefined1 (*) [32])(H + 5);
      uVar135 = 1;
      uVar142 = 0;
      do {
        auVar147 = vpunpcklqdq_avx2(*(undefined1 (*) [32])(H + uVar142 * 0x32 + 1),
                                    *(undefined1 (*) [32])(H + uVar142 * 0x32 + 0x32));
        auVar148 = vpunpcklqdq_avx2(*(undefined1 (*) [32])(H + uVar142 * 0x32 + 99),
                                    *(undefined1 (*) [32])(H + uVar142 * 0x32 + 0x94));
        auVar165 = vperm2i128_avx2(auVar147,auVar148,0x31);
        auVar147 = vpunpckhqdq_avx2(*(undefined1 (*) [32])(H + uVar142 * 0x32 + 1),
                                    *(undefined1 (*) [32])(H + uVar142 * 0x32 + 0x32));
        auVar148 = vpunpckhqdq_avx2(*(undefined1 (*) [32])(H + uVar142 * 0x32 + 99),
                                    *(undefined1 (*) [32])(H + uVar142 * 0x32 + 0x94));
        auVar148 = vperm2i128_avx2(auVar147,auVar148,0x31);
        H[uVar142 * 0x32 + 0x31] = H[uVar142 * 0x32 + 1];
        *(undefined1 (*) [16])(H + uVar142 * 0x32 + 0x62) = auVar147._0_16_;
        *(undefined1 (*) [32])(H + uVar142 * 0x32 + 0x93) = auVar165;
        *(undefined1 (*) [32])(H + uVar142 * 0x32 + 0xc4) = auVar148;
        pauVar133 = pauVar124;
        pauVar141 = pauVar125;
        uVar138 = uVar135;
        if (uVar142 < 0x2c) {
          do {
            auVar165 = vpunpcklqdq_avx2(*pauVar141,*(undefined1 (*) [32])(pauVar141[0xc] + 8));
            auVar1 = vpunpcklqdq_avx2(*(undefined1 (*) [32])(pauVar141[0x18] + 0x10),
                                      *(undefined1 (*) [32])(pauVar141[0x24] + 0x18));
            auVar147 = vpunpckhqdq_avx2(*pauVar141,*(undefined1 (*) [32])(pauVar141[0xc] + 8));
            auVar148 = vpunpckhqdq_avx2(*(undefined1 (*) [32])(pauVar141[0x18] + 0x10),
                                        *(undefined1 (*) [32])(pauVar141[0x24] + 0x18));
            auVar164._0_16_ = ZEXT116(0) * auVar1._0_16_ + ZEXT116(1) * auVar165._0_16_;
            auVar164._16_16_ = ZEXT116(0) * auVar165._16_16_ + ZEXT116(1) * auVar1._0_16_;
            auVar176._0_16_ = ZEXT116(0) * auVar148._0_16_ + ZEXT116(1) * auVar147._0_16_;
            auVar176._16_16_ = ZEXT116(0) * auVar147._16_16_ + ZEXT116(1) * auVar148._0_16_;
            auVar165 = vperm2i128_avx2(auVar165,auVar1,0x31);
            auVar147 = vperm2i128_avx2(auVar147,auVar148,0x31);
            *pauVar133 = auVar164;
            *(undefined1 (*) [32])(pauVar133[0xc] + 8) = auVar176;
            *(undefined1 (*) [32])(pauVar133[0x18] + 0x10) = auVar165;
            *(undefined1 (*) [32])(pauVar133[0x24] + 0x18) = auVar147;
            uVar138 = uVar138 + 4;
            pauVar133 = pauVar133 + 0x31;
            pauVar141 = pauVar141 + 1;
          } while (uVar138 < 0x2d);
        }
        uVar135 = uVar135 + 4;
        pauVar124 = pauVar124 + 0x32;
        pauVar125 = pauVar125 + 0x32;
        bVar3 = uVar142 < 0x2c;
        uVar142 = uVar142 + 4;
      } while (bVar3);
    }
  }
  else {
    av1_compute_stats_c(wiener_win,dgd,src,dgd_avg,src_avg,h_start,h_end,v_start,v_end,dgd_stride,
                        src_stride,M,H,use_downsampled_wiener_stats);
  }
  return;
}

Assistant:

void av1_compute_stats_avx2(int wiener_win, const uint8_t *dgd,
                            const uint8_t *src, int16_t *dgd_avg,
                            int16_t *src_avg, int h_start, int h_end,
                            int v_start, int v_end, int dgd_stride,
                            int src_stride, int64_t *M, int64_t *H,
                            int use_downsampled_wiener_stats) {
  if (wiener_win != WIENER_WIN && wiener_win != WIENER_WIN_CHROMA) {
    // Currently, libaom supports Wiener filter processing with window sizes as
    // WIENER_WIN_CHROMA(5) and WIENER_WIN(7). For any other window size, SIMD
    // support is not facilitated. Hence, invoke C function for the same.
    av1_compute_stats_c(wiener_win, dgd, src, dgd_avg, src_avg, h_start, h_end,
                        v_start, v_end, dgd_stride, src_stride, M, H,
                        use_downsampled_wiener_stats);
    return;
  }

  const int32_t wiener_halfwin = wiener_win >> 1;
  const uint8_t avg =
      calc_dgd_buf_avg_avx2(dgd, h_start, h_end, v_start, v_end, dgd_stride);
  const int32_t width = h_end - h_start;
  const int32_t height = v_end - v_start;
  const int32_t d_stride = (width + 2 * wiener_halfwin + 15) & ~15;
  const int32_t s_stride = (width + 15) & ~15;

  // Based on the sf 'use_downsampled_wiener_stats', process either once for
  // UPDATE_DOWNSAMPLE_FACTOR or for each row.
  sub_avg_block_avx2(src + v_start * src_stride + h_start, src_stride, avg,
                     width, height, src_avg, s_stride,
                     use_downsampled_wiener_stats);

  // Compute (dgd-avg) buffer here which is used to fill H buffer.
  sub_avg_block_avx2(
      dgd + (v_start - wiener_halfwin) * dgd_stride + h_start - wiener_halfwin,
      dgd_stride, avg, width + 2 * wiener_halfwin, height + 2 * wiener_halfwin,
      dgd_avg, d_stride, 0);
  if (wiener_win == WIENER_WIN) {
    compute_stats_win7_avx2(dgd_avg, d_stride, src_avg, s_stride, width,
                            v_start, v_end, M, H, use_downsampled_wiener_stats);
  } else if (wiener_win == WIENER_WIN_CHROMA) {
    compute_stats_win5_avx2(dgd_avg, d_stride, src_avg, s_stride, width,
                            v_start, v_end, M, H, use_downsampled_wiener_stats);
  }
}